

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  ulong uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  byte bVar87;
  uint uVar88;
  uint uVar89;
  ulong uVar90;
  undefined1 (*pauVar91) [32];
  uint uVar92;
  uint uVar93;
  long lVar94;
  bool bVar95;
  int iVar96;
  ulong uVar97;
  bool bVar98;
  vint4 bi_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar112 [16];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar144;
  float fVar145;
  vint4 bi;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar147;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar146;
  float fVar148;
  float fVar149;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar150;
  float fVar171;
  float fVar172;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar178;
  float fVar181;
  float fVar184;
  undefined1 auVar161 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar157 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar160 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar190;
  float fVar211;
  float fVar212;
  vint4 ai_1;
  undefined1 auVar191 [16];
  float fVar213;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [28];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar214;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar215;
  float fVar234;
  float fVar235;
  vint4 ai_2;
  undefined1 auVar216 [16];
  float fVar236;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar237;
  float fVar239;
  undefined1 auVar228 [28];
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar240;
  float fVar249;
  float fVar251;
  undefined1 auVar241 [16];
  float fVar253;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar250;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar258;
  float fVar269;
  float fVar270;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar263 [32];
  float fVar271;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar288;
  vint4 ai;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar290;
  float fVar291;
  undefined1 auVar282 [32];
  float fVar289;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar292;
  float fVar293;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  float s;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar316 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [16];
  float fVar359;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar360;
  float fVar361;
  float fVar365;
  float fVar367;
  undefined1 auVar362 [16];
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar378;
  float fVar379;
  float fVar384;
  float fVar386;
  undefined1 auVar380 [16];
  float fVar385;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar399 [32];
  float fVar400;
  float fVar401;
  float fVar404;
  float fVar406;
  float fVar408;
  float fVar410;
  float fVar412;
  float fVar414;
  undefined1 auVar402 [32];
  float fVar405;
  float fVar407;
  float fVar409;
  float fVar411;
  float fVar413;
  float fVar415;
  undefined1 auVar403 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b24;
  int local_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  float local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  uint local_8a8;
  uint local_8a4;
  uint local_8a0;
  ulong local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar358 [64];
  
  PVar12 = prim[1];
  uVar97 = (ulong)(byte)PVar12;
  lVar17 = uVar97 * 0x25;
  fVar123 = *(float *)(prim + lVar17 + 0x12);
  auVar260 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar17 + 6));
  auVar124._0_4_ = fVar123 * auVar260._0_4_;
  auVar124._4_4_ = fVar123 * auVar260._4_4_;
  auVar124._8_4_ = fVar123 * auVar260._8_4_;
  auVar124._12_4_ = fVar123 * auVar260._12_4_;
  auVar275._0_4_ = fVar123 * (ray->dir).field_0.m128[0];
  auVar275._4_4_ = fVar123 * (ray->dir).field_0.m128[1];
  auVar275._8_4_ = fVar123 * (ray->dir).field_0.m128[2];
  auVar275._12_4_ = fVar123 * (ray->dir).field_0.m128[3];
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 6)));
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar97 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vshufps_avx(auVar275,auVar275,0);
  auVar135 = vshufps_avx(auVar275,auVar275,0x55);
  auVar21 = vshufps_avx(auVar275,auVar275,0xaa);
  fVar123 = auVar21._0_4_;
  fVar144 = auVar21._4_4_;
  fVar146 = auVar21._8_4_;
  fVar149 = auVar21._12_4_;
  fVar215 = auVar135._0_4_;
  fVar234 = auVar135._4_4_;
  fVar235 = auVar135._8_4_;
  fVar236 = auVar135._12_4_;
  fVar190 = auVar20._0_4_;
  fVar211 = auVar20._4_4_;
  fVar212 = auVar20._8_4_;
  fVar213 = auVar20._12_4_;
  auVar362._0_4_ = fVar190 * auVar260._0_4_ + fVar215 * auVar223._0_4_ + fVar123 * auVar18._0_4_;
  auVar362._4_4_ = fVar211 * auVar260._4_4_ + fVar234 * auVar223._4_4_ + fVar144 * auVar18._4_4_;
  auVar362._8_4_ = fVar212 * auVar260._8_4_ + fVar235 * auVar223._8_4_ + fVar146 * auVar18._8_4_;
  auVar362._12_4_ = fVar213 * auVar260._12_4_ + fVar236 * auVar223._12_4_ + fVar149 * auVar18._12_4_
  ;
  auVar380._0_4_ = fVar190 * auVar200._0_4_ + fVar215 * auVar108._0_4_ + auVar131._0_4_ * fVar123;
  auVar380._4_4_ = fVar211 * auVar200._4_4_ + fVar234 * auVar108._4_4_ + auVar131._4_4_ * fVar144;
  auVar380._8_4_ = fVar212 * auVar200._8_4_ + fVar235 * auVar108._8_4_ + auVar131._8_4_ * fVar146;
  auVar380._12_4_ =
       fVar213 * auVar200._12_4_ + fVar236 * auVar108._12_4_ + auVar131._12_4_ * fVar149;
  auVar276._0_4_ = fVar190 * auVar128._0_4_ + fVar215 * auVar132._0_4_ + auVar19._0_4_ * fVar123;
  auVar276._4_4_ = fVar211 * auVar128._4_4_ + fVar234 * auVar132._4_4_ + auVar19._4_4_ * fVar144;
  auVar276._8_4_ = fVar212 * auVar128._8_4_ + fVar235 * auVar132._8_4_ + auVar19._8_4_ * fVar146;
  auVar276._12_4_ = fVar213 * auVar128._12_4_ + fVar236 * auVar132._12_4_ + auVar19._12_4_ * fVar149
  ;
  auVar20 = vshufps_avx(auVar124,auVar124,0);
  auVar135 = vshufps_avx(auVar124,auVar124,0x55);
  auVar21 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar123 = auVar21._0_4_;
  fVar144 = auVar21._4_4_;
  fVar146 = auVar21._8_4_;
  fVar149 = auVar21._12_4_;
  fVar215 = auVar135._0_4_;
  fVar234 = auVar135._4_4_;
  fVar235 = auVar135._8_4_;
  fVar236 = auVar135._12_4_;
  fVar190 = auVar20._0_4_;
  fVar211 = auVar20._4_4_;
  fVar212 = auVar20._8_4_;
  fVar213 = auVar20._12_4_;
  auVar125._0_4_ = fVar190 * auVar260._0_4_ + fVar215 * auVar223._0_4_ + fVar123 * auVar18._0_4_;
  auVar125._4_4_ = fVar211 * auVar260._4_4_ + fVar234 * auVar223._4_4_ + fVar144 * auVar18._4_4_;
  auVar125._8_4_ = fVar212 * auVar260._8_4_ + fVar235 * auVar223._8_4_ + fVar146 * auVar18._8_4_;
  auVar125._12_4_ = fVar213 * auVar260._12_4_ + fVar236 * auVar223._12_4_ + fVar149 * auVar18._12_4_
  ;
  auVar99._0_4_ = fVar190 * auVar200._0_4_ + auVar131._0_4_ * fVar123 + fVar215 * auVar108._0_4_;
  auVar99._4_4_ = fVar211 * auVar200._4_4_ + auVar131._4_4_ * fVar144 + fVar234 * auVar108._4_4_;
  auVar99._8_4_ = fVar212 * auVar200._8_4_ + auVar131._8_4_ * fVar146 + fVar235 * auVar108._8_4_;
  auVar99._12_4_ = fVar213 * auVar200._12_4_ + auVar131._12_4_ * fVar149 + fVar236 * auVar108._12_4_
  ;
  auVar294._8_4_ = 0x7fffffff;
  auVar294._0_8_ = 0x7fffffff7fffffff;
  auVar294._12_4_ = 0x7fffffff;
  auVar260 = vandps_avx(auVar362,auVar294);
  auVar216._8_4_ = 0x219392ef;
  auVar216._0_8_ = 0x219392ef219392ef;
  auVar216._12_4_ = 0x219392ef;
  auVar260 = vcmpps_avx(auVar260,auVar216,1);
  auVar223 = vblendvps_avx(auVar362,auVar216,auVar260);
  auVar260 = vandps_avx(auVar380,auVar294);
  auVar260 = vcmpps_avx(auVar260,auVar216,1);
  auVar18 = vblendvps_avx(auVar380,auVar216,auVar260);
  auVar260 = vandps_avx(auVar294,auVar276);
  auVar260 = vcmpps_avx(auVar260,auVar216,1);
  auVar260 = vblendvps_avx(auVar276,auVar216,auVar260);
  auVar151._0_4_ = fVar190 * auVar128._0_4_ + fVar215 * auVar132._0_4_ + auVar19._0_4_ * fVar123;
  auVar151._4_4_ = fVar211 * auVar128._4_4_ + fVar234 * auVar132._4_4_ + auVar19._4_4_ * fVar144;
  auVar151._8_4_ = fVar212 * auVar128._8_4_ + fVar235 * auVar132._8_4_ + auVar19._8_4_ * fVar146;
  auVar151._12_4_ = fVar213 * auVar128._12_4_ + fVar236 * auVar132._12_4_ + auVar19._12_4_ * fVar149
  ;
  auVar200 = vrcpps_avx(auVar223);
  fVar190 = auVar200._0_4_;
  auVar191._0_4_ = fVar190 * auVar223._0_4_;
  fVar211 = auVar200._4_4_;
  auVar191._4_4_ = fVar211 * auVar223._4_4_;
  fVar212 = auVar200._8_4_;
  auVar191._8_4_ = fVar212 * auVar223._8_4_;
  fVar213 = auVar200._12_4_;
  auVar191._12_4_ = fVar213 * auVar223._12_4_;
  auVar259._8_4_ = 0x3f800000;
  auVar259._0_8_ = 0x3f8000003f800000;
  auVar259._12_4_ = 0x3f800000;
  auVar223 = vsubps_avx(auVar259,auVar191);
  fVar190 = fVar190 + fVar190 * auVar223._0_4_;
  fVar211 = fVar211 + fVar211 * auVar223._4_4_;
  fVar212 = fVar212 + fVar212 * auVar223._8_4_;
  fVar213 = fVar213 + fVar213 * auVar223._12_4_;
  auVar223 = vrcpps_avx(auVar18);
  fVar215 = auVar223._0_4_;
  auVar241._0_4_ = fVar215 * auVar18._0_4_;
  fVar234 = auVar223._4_4_;
  auVar241._4_4_ = fVar234 * auVar18._4_4_;
  fVar235 = auVar223._8_4_;
  auVar241._8_4_ = fVar235 * auVar18._8_4_;
  fVar236 = auVar223._12_4_;
  auVar241._12_4_ = fVar236 * auVar18._12_4_;
  auVar223 = vsubps_avx(auVar259,auVar241);
  fVar215 = fVar215 + fVar215 * auVar223._0_4_;
  fVar234 = fVar234 + fVar234 * auVar223._4_4_;
  fVar235 = fVar235 + fVar235 * auVar223._8_4_;
  fVar236 = fVar236 + fVar236 * auVar223._12_4_;
  auVar223 = vrcpps_avx(auVar260);
  fVar240 = auVar223._0_4_;
  auVar277._0_4_ = fVar240 * auVar260._0_4_;
  fVar249 = auVar223._4_4_;
  auVar277._4_4_ = fVar249 * auVar260._4_4_;
  fVar251 = auVar223._8_4_;
  auVar277._8_4_ = fVar251 * auVar260._8_4_;
  fVar253 = auVar223._12_4_;
  auVar277._12_4_ = fVar253 * auVar260._12_4_;
  auVar260 = vsubps_avx(auVar259,auVar277);
  fVar240 = fVar240 + fVar240 * auVar260._0_4_;
  fVar249 = fVar249 + fVar249 * auVar260._4_4_;
  fVar251 = fVar251 + fVar251 * auVar260._8_4_;
  fVar253 = fVar253 + fVar253 * auVar260._12_4_;
  auVar260 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar17 + 0x16)) *
                           *(float *)(prim + lVar17 + 0x1a)));
  auVar18 = vshufps_avx(auVar260,auVar260,0);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar260 = vpmovsxwd_avx(auVar260);
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar223 = vpmovsxwd_avx(auVar223);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar200 = vsubps_avx(auVar223,auVar260);
  fVar123 = auVar18._0_4_;
  fVar144 = auVar18._4_4_;
  fVar146 = auVar18._8_4_;
  fVar149 = auVar18._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar223 = vpmovsxwd_avx(auVar18);
  auVar278._0_4_ = auVar200._0_4_ * fVar123 + auVar260._0_4_;
  auVar278._4_4_ = auVar200._4_4_ * fVar144 + auVar260._4_4_;
  auVar278._8_4_ = auVar200._8_4_ * fVar146 + auVar260._8_4_;
  auVar278._12_4_ = auVar200._12_4_ * fVar149 + auVar260._12_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 6);
  auVar18 = vpmovsxwd_avx(auVar200);
  auVar260 = vcvtdq2ps_avx(auVar223);
  auVar223 = vcvtdq2ps_avx(auVar18);
  auVar223 = vsubps_avx(auVar223,auVar260);
  auVar295._0_4_ = auVar223._0_4_ * fVar123 + auVar260._0_4_;
  auVar295._4_4_ = auVar223._4_4_ * fVar144 + auVar260._4_4_;
  auVar295._8_4_ = auVar223._8_4_ * fVar146 + auVar260._8_4_;
  auVar295._12_4_ = auVar223._12_4_ * fVar149 + auVar260._12_4_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 6);
  auVar260 = vpmovsxwd_avx(auVar108);
  uVar90 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar97 * 2 + uVar90 + 6);
  auVar223 = vpmovsxwd_avx(auVar131);
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar260);
  auVar316._0_4_ = auVar223._0_4_ * fVar123 + auVar260._0_4_;
  auVar316._4_4_ = auVar223._4_4_ * fVar144 + auVar260._4_4_;
  auVar316._8_4_ = auVar223._8_4_ * fVar146 + auVar260._8_4_;
  auVar316._12_4_ = auVar223._12_4_ * fVar149 + auVar260._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar260 = vpmovsxwd_avx(auVar128);
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 6);
  auVar223 = vpmovsxwd_avx(auVar132);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar18 = vsubps_avx(auVar223,auVar260);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 6);
  auVar223 = vpmovsxwd_avx(auVar19);
  auVar345._0_4_ = auVar18._0_4_ * fVar123 + auVar260._0_4_;
  auVar345._4_4_ = auVar18._4_4_ * fVar144 + auVar260._4_4_;
  auVar345._8_4_ = auVar18._8_4_ * fVar146 + auVar260._8_4_;
  auVar345._12_4_ = auVar18._12_4_ * fVar149 + auVar260._12_4_;
  auVar260 = vcvtdq2ps_avx(auVar223);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar97 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar223 = vpmovsxwd_avx(auVar20);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar260);
  auVar353._0_4_ = auVar223._0_4_ * fVar123 + auVar260._0_4_;
  auVar353._4_4_ = auVar223._4_4_ * fVar144 + auVar260._4_4_;
  auVar353._8_4_ = auVar223._8_4_ * fVar146 + auVar260._8_4_;
  auVar353._12_4_ = auVar223._12_4_ * fVar149 + auVar260._12_4_;
  auVar358 = ZEXT1664(auVar353);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar97) + 6);
  auVar260 = vpmovsxwd_avx(auVar135);
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 6);
  auVar223 = vpmovsxwd_avx(auVar21);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar223 = vsubps_avx(auVar223,auVar260);
  auVar261._0_4_ = auVar260._0_4_ + auVar223._0_4_ * fVar123;
  auVar261._4_4_ = auVar260._4_4_ + auVar223._4_4_ * fVar144;
  auVar261._8_4_ = auVar260._8_4_ + auVar223._8_4_ * fVar146;
  auVar261._12_4_ = auVar260._12_4_ + auVar223._12_4_ * fVar149;
  auVar260 = vsubps_avx(auVar278,auVar125);
  auVar279._0_4_ = fVar190 * auVar260._0_4_;
  auVar279._4_4_ = fVar211 * auVar260._4_4_;
  auVar279._8_4_ = fVar212 * auVar260._8_4_;
  auVar279._12_4_ = fVar213 * auVar260._12_4_;
  auVar260 = vsubps_avx(auVar295,auVar125);
  auVar126._0_4_ = fVar190 * auVar260._0_4_;
  auVar126._4_4_ = fVar211 * auVar260._4_4_;
  auVar126._8_4_ = fVar212 * auVar260._8_4_;
  auVar126._12_4_ = fVar213 * auVar260._12_4_;
  auVar260 = vsubps_avx(auVar316,auVar99);
  auVar192._0_4_ = fVar215 * auVar260._0_4_;
  auVar192._4_4_ = fVar234 * auVar260._4_4_;
  auVar192._8_4_ = fVar235 * auVar260._8_4_;
  auVar192._12_4_ = fVar236 * auVar260._12_4_;
  auVar260 = vsubps_avx(auVar345,auVar99);
  auVar100._0_4_ = fVar215 * auVar260._0_4_;
  auVar100._4_4_ = fVar234 * auVar260._4_4_;
  auVar100._8_4_ = fVar235 * auVar260._8_4_;
  auVar100._12_4_ = fVar236 * auVar260._12_4_;
  auVar260 = vsubps_avx(auVar353,auVar151);
  auVar217._0_4_ = fVar240 * auVar260._0_4_;
  auVar217._4_4_ = fVar249 * auVar260._4_4_;
  auVar217._8_4_ = fVar251 * auVar260._8_4_;
  auVar217._12_4_ = fVar253 * auVar260._12_4_;
  auVar260 = vsubps_avx(auVar261,auVar151);
  auVar152._0_4_ = fVar240 * auVar260._0_4_;
  auVar152._4_4_ = fVar249 * auVar260._4_4_;
  auVar152._8_4_ = fVar251 * auVar260._8_4_;
  auVar152._12_4_ = fVar253 * auVar260._12_4_;
  auVar260 = vpminsd_avx(auVar279,auVar126);
  auVar223 = vpminsd_avx(auVar192,auVar100);
  auVar260 = vmaxps_avx(auVar260,auVar223);
  auVar223 = vpminsd_avx(auVar217,auVar152);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar296._4_4_ = uVar7;
  auVar296._0_4_ = uVar7;
  auVar296._8_4_ = uVar7;
  auVar296._12_4_ = uVar7;
  auVar223 = vmaxps_avx(auVar223,auVar296);
  auVar260 = vmaxps_avx(auVar260,auVar223);
  local_4e0._0_4_ = auVar260._0_4_ * 0.99999964;
  local_4e0._4_4_ = auVar260._4_4_ * 0.99999964;
  local_4e0._8_4_ = auVar260._8_4_ * 0.99999964;
  local_4e0._12_4_ = auVar260._12_4_ * 0.99999964;
  auVar260 = vpmaxsd_avx(auVar279,auVar126);
  auVar223 = vpmaxsd_avx(auVar192,auVar100);
  auVar260 = vminps_avx(auVar260,auVar223);
  auVar223 = vpmaxsd_avx(auVar217,auVar152);
  fVar123 = ray->tfar;
  auVar153._4_4_ = fVar123;
  auVar153._0_4_ = fVar123;
  auVar153._8_4_ = fVar123;
  auVar153._12_4_ = fVar123;
  auVar223 = vminps_avx(auVar223,auVar153);
  auVar260 = vminps_avx(auVar260,auVar223);
  auVar101._0_4_ = auVar260._0_4_ * 1.0000004;
  auVar101._4_4_ = auVar260._4_4_ * 1.0000004;
  auVar101._8_4_ = auVar260._8_4_ * 1.0000004;
  auVar101._12_4_ = auVar260._12_4_ * 1.0000004;
  auVar260 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar223 = vpcmpgtd_avx(auVar260,_DAT_01f7fcf0);
  auVar260 = vcmpps_avx(local_4e0,auVar101,2);
  auVar260 = vandps_avx(auVar260,auVar223);
  uVar88 = vmovmskps_avx(auVar260);
  if (uVar88 == 0) {
    return false;
  }
  uVar88 = uVar88 & 0xff;
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  local_790 = prim;
LAB_00f92751:
  local_788 = (ulong)uVar88;
  lVar17 = 0;
  if (local_788 != 0) {
    for (; (uVar88 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  uVar88 = *(uint *)(local_790 + 2);
  local_888 = (ulong)*(uint *)(local_790 + lVar17 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[uVar88].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           local_888 *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar123 = (pGVar13->time_range).lower;
  fVar123 = pGVar13->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar123) / ((pGVar13->time_range).upper - fVar123));
  auVar260 = vroundss_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),9);
  auVar260 = vminss_avx(auVar260,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar260 = vmaxss_avx(ZEXT816(0) << 0x20,auVar260);
  fVar123 = fVar123 - auVar260._0_4_;
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar94 = (long)(int)auVar260._0_4_ * 0x38;
  lVar17 = *(long *)(_Var14 + lVar94);
  lVar15 = *(long *)(_Var14 + 0x10 + lVar94);
  auVar260 = vshufps_avx(ZEXT416((uint)(1.0 - fVar123)),ZEXT416((uint)(1.0 - fVar123)),0);
  pfVar1 = (float *)(lVar17 + lVar15 * uVar97);
  fVar144 = auVar260._0_4_;
  fVar146 = auVar260._4_4_;
  fVar190 = auVar260._8_4_;
  fVar212 = auVar260._12_4_;
  pfVar2 = (float *)(lVar17 + lVar15 * (uVar97 + 1));
  pfVar3 = (float *)(lVar17 + lVar15 * (uVar97 + 2));
  pfVar4 = (float *)(lVar17 + lVar15 * (uVar97 + 3));
  lVar17 = *(long *)(_Var14 + 0x38 + lVar94);
  lVar15 = *(long *)(_Var14 + 0x48 + lVar94);
  auVar260 = vshufps_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),0);
  pfVar5 = (float *)(lVar17 + uVar97 * lVar15);
  fVar213 = auVar260._0_4_;
  fVar215 = auVar260._4_4_;
  fVar234 = auVar260._8_4_;
  fVar235 = auVar260._12_4_;
  pfVar6 = (float *)(lVar17 + (uVar97 + 1) * lVar15);
  auVar193._0_4_ = fVar213 * *pfVar5 + fVar144 * *pfVar1;
  auVar193._4_4_ = fVar215 * pfVar5[1] + fVar146 * pfVar1[1];
  auVar193._8_4_ = fVar234 * pfVar5[2] + fVar190 * pfVar1[2];
  auVar193._12_4_ = fVar235 * pfVar5[3] + fVar212 * pfVar1[3];
  auVar218._0_4_ = fVar144 * *pfVar2 + fVar213 * *pfVar6;
  auVar218._4_4_ = fVar146 * pfVar2[1] + fVar215 * pfVar6[1];
  auVar218._8_4_ = fVar190 * pfVar2[2] + fVar234 * pfVar6[2];
  auVar218._12_4_ = fVar212 * pfVar2[3] + fVar235 * pfVar6[3];
  auVar102._0_4_ = (auVar193._0_4_ + auVar218._0_4_) * 0.5;
  auVar102._4_4_ = (auVar193._4_4_ + auVar218._4_4_) * 0.5;
  auVar102._8_4_ = (auVar193._8_4_ + auVar218._8_4_) * 0.5;
  auVar102._12_4_ = (auVar193._12_4_ + auVar218._12_4_) * 0.5;
  aVar9 = (ray->org).field_0.field_1;
  aVar10 = (ray->dir).field_0.field_1;
  auVar260 = vsubps_avx(auVar102,(undefined1  [16])aVar9);
  auVar260 = vdpps_avx(auVar260,(undefined1  [16])aVar10,0x7f);
  auVar223 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  pfVar1 = (float *)(lVar17 + (uVar97 + 2) * lVar15);
  auVar242._0_4_ = fVar213 * *pfVar1 + fVar144 * *pfVar3;
  auVar242._4_4_ = fVar215 * pfVar1[1] + fVar146 * pfVar3[1];
  auVar242._8_4_ = fVar234 * pfVar1[2] + fVar190 * pfVar3[2];
  auVar242._12_4_ = fVar235 * pfVar1[3] + fVar212 * pfVar3[3];
  auVar18 = vrcpss_avx(auVar223,auVar223);
  fVar123 = auVar18._0_4_ * (2.0 - auVar223._0_4_ * auVar18._0_4_) * auVar260._0_4_;
  local_7a0 = ZEXT416((uint)fVar123);
  auVar223 = vshufps_avx(local_7a0,ZEXT416((uint)fVar123),0);
  fVar123 = aVar10.x;
  fVar149 = aVar10.y;
  fVar211 = aVar10.z;
  aVar147 = aVar10.field_3;
  auVar280._0_4_ = fVar123 * auVar223._0_4_ + aVar9.x;
  auVar280._4_4_ = fVar149 * auVar223._4_4_ + aVar9.y;
  auVar280._8_4_ = fVar211 * auVar223._8_4_ + aVar9.z;
  auVar280._12_4_ = aVar147.w * auVar223._12_4_ + aVar9.field_3.w;
  auVar260 = vblendps_avx(auVar280,_DAT_01f7aa10,8);
  _local_920 = vsubps_avx(auVar193,auVar260);
  auVar297 = ZEXT1664(_local_920);
  _local_930 = vsubps_avx(auVar242,auVar260);
  pfVar1 = (float *)(lVar17 + lVar15 * (uVar97 + 3));
  auVar154._0_4_ = fVar144 * *pfVar4 + fVar213 * *pfVar1;
  auVar154._4_4_ = fVar146 * pfVar4[1] + fVar215 * pfVar1[1];
  auVar154._8_4_ = fVar190 * pfVar4[2] + fVar234 * pfVar1[2];
  auVar154._12_4_ = fVar212 * pfVar4[3] + fVar235 * pfVar1[3];
  _local_940 = vsubps_avx(auVar218,auVar260);
  _local_950 = vsubps_avx(auVar154,auVar260);
  auVar260 = vshufps_avx(_local_920,_local_920,0);
  register0x00001290 = auVar260;
  _local_1e0 = auVar260;
  auVar260 = vshufps_avx(_local_920,_local_920,0x55);
  register0x00001290 = auVar260;
  _local_200 = auVar260;
  auVar260 = vshufps_avx(_local_920,_local_920,0xaa);
  register0x00001290 = auVar260;
  _local_220 = auVar260;
  auVar260 = vshufps_avx(_local_920,_local_920,0xff);
  register0x00001290 = auVar260;
  _local_240 = auVar260;
  auVar260 = vshufps_avx(_local_940,_local_940,0);
  register0x00001290 = auVar260;
  _local_320 = auVar260;
  auVar260 = vshufps_avx(_local_940,_local_940,0x55);
  register0x00001290 = auVar260;
  _local_340 = auVar260;
  auVar260 = vshufps_avx(_local_940,_local_940,0xaa);
  register0x00001290 = auVar260;
  _local_360 = auVar260;
  auVar127._0_4_ = fVar123 * fVar123;
  auVar127._4_4_ = fVar149 * fVar149;
  auVar127._8_4_ = fVar211 * fVar211;
  auVar127._12_4_ = aVar147.w * aVar147.w;
  auVar260 = vshufps_avx(auVar127,auVar127,0xaa);
  auVar18 = vshufps_avx(auVar127,auVar127,0x55);
  auVar200 = vshufps_avx(_local_940,_local_940,0xff);
  register0x000012d0 = auVar200;
  _local_260 = auVar200;
  auVar200 = vshufps_avx(auVar127,auVar127,0);
  local_280._0_4_ = auVar200._0_4_ + auVar18._0_4_ + auVar260._0_4_;
  local_280._4_4_ = auVar200._4_4_ + auVar18._4_4_ + auVar260._4_4_;
  local_280._8_4_ = auVar200._8_4_ + auVar18._8_4_ + auVar260._8_4_;
  local_280._12_4_ = auVar200._12_4_ + auVar18._12_4_ + auVar260._12_4_;
  local_280._16_4_ = auVar200._0_4_ + auVar18._0_4_ + auVar260._0_4_;
  local_280._20_4_ = auVar200._4_4_ + auVar18._4_4_ + auVar260._4_4_;
  local_280._24_4_ = auVar200._8_4_ + auVar18._8_4_ + auVar260._8_4_;
  local_280._28_4_ = auVar200._12_4_ + auVar18._12_4_ + auVar260._12_4_;
  auVar260 = vshufps_avx(_local_930,_local_930,0);
  local_400._16_16_ = auVar260;
  local_400._0_16_ = auVar260;
  auVar260 = vshufps_avx(_local_930,_local_930,0x55);
  register0x00001250 = auVar260;
  _local_380 = auVar260;
  auVar260 = vshufps_avx(_local_930,_local_930,0xaa);
  register0x00001250 = auVar260;
  _local_3a0 = auVar260;
  auVar260 = vshufps_avx(_local_930,_local_930,0xff);
  register0x00001250 = auVar260;
  _local_3c0 = auVar260;
  auVar260 = vshufps_avx(_local_950,_local_950,0);
  auVar18 = vshufps_avx(_local_950,_local_950,0x55);
  auVar200 = vshufps_avx(_local_950,_local_950,0xaa);
  register0x00001250 = auVar200;
  _local_3e0 = auVar200;
  auVar200 = vshufps_avx(_local_950,_local_950,0xff);
  register0x00001250 = auVar200;
  _local_2a0 = auVar200;
  register0x00001210 = auVar223;
  _local_9e0 = auVar223;
  local_b24 = 1;
  uVar97 = 0;
  bVar95 = false;
  local_660 = (ray->dir).field_0.m128[0];
  local_520 = (ray->dir).field_0.m128[1];
  local_540 = (ray->dir).field_0.m128[2];
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  local_420 = vandps_avx(local_280,auVar114);
  local_4d0 = ZEXT816(0x3f80000000000000);
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  do {
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar229._16_4_ = 0x3f800000;
    auVar229._20_4_ = 0x3f800000;
    iVar96 = (int)uVar97;
    auVar229._24_4_ = 0x3f800000;
    auVar229._28_4_ = 0x3f800000;
    auVar223 = vmovshdup_avx(local_4d0);
    auVar108 = vsubps_avx(auVar223,local_4d0);
    auVar223 = vshufps_avx(local_4d0,local_4d0,0);
    local_880._16_16_ = auVar223;
    local_880._0_16_ = auVar223;
    auVar200 = vshufps_avx(auVar108,auVar108,0);
    local_6c0._16_16_ = auVar200;
    local_6c0._0_16_ = auVar200;
    fVar413 = auVar200._0_4_;
    fVar415 = auVar200._4_4_;
    fVar145 = auVar200._8_4_;
    fVar148 = auVar200._12_4_;
    fVar405 = auVar223._0_4_;
    auVar206._0_4_ = fVar405 + fVar413 * 0.0;
    fVar407 = auVar223._4_4_;
    auVar206._4_4_ = fVar407 + fVar415 * 0.14285715;
    fVar409 = auVar223._8_4_;
    auVar206._8_4_ = fVar409 + fVar145 * 0.2857143;
    fVar411 = auVar223._12_4_;
    auVar206._12_4_ = fVar411 + fVar148 * 0.42857146;
    auVar206._16_4_ = fVar405 + fVar413 * 0.5714286;
    auVar206._20_4_ = fVar407 + fVar415 * 0.71428573;
    auVar206._24_4_ = fVar409 + fVar145 * 0.8571429;
    auVar206._28_4_ = fVar411 + fVar148;
    auVar113 = vsubps_avx(auVar229,auVar206);
    auVar161._0_4_ = auVar206._0_4_ * auVar206._0_4_;
    auVar161._4_4_ = auVar206._4_4_ * auVar206._4_4_;
    auVar161._8_4_ = auVar206._8_4_ * auVar206._8_4_;
    auVar161._12_4_ = auVar206._12_4_ * auVar206._12_4_;
    auVar161._16_4_ = auVar206._16_4_ * auVar206._16_4_;
    auVar161._20_4_ = auVar206._20_4_ * auVar206._20_4_;
    auVar161._24_4_ = auVar206._24_4_ * auVar206._24_4_;
    auVar161._28_4_ = 0;
    fVar234 = auVar206._0_4_ * 3.0;
    fVar235 = auVar206._4_4_ * 3.0;
    fVar236 = auVar206._8_4_ * 3.0;
    fVar240 = auVar206._12_4_ * 3.0;
    fVar249 = auVar206._16_4_ * 3.0;
    fVar251 = auVar206._20_4_ * 3.0;
    fVar239 = auVar206._24_4_ * 3.0;
    fVar123 = auVar113._0_4_;
    auVar298._0_4_ = fVar123 * fVar123;
    fVar144 = auVar113._4_4_;
    auVar298._4_4_ = fVar144 * fVar144;
    fVar146 = auVar113._8_4_;
    auVar298._8_4_ = fVar146 * fVar146;
    fVar149 = auVar113._12_4_;
    auVar298._12_4_ = fVar149 * fVar149;
    fVar190 = auVar113._16_4_;
    auVar298._16_4_ = fVar190 * fVar190;
    fVar211 = auVar113._20_4_;
    auVar298._20_4_ = fVar211 * fVar211;
    fVar212 = auVar113._24_4_;
    auVar298._28_36_ = auVar297._28_36_;
    auVar298._24_4_ = fVar212 * fVar212;
    fVar213 = auVar113._28_4_;
    fVar253 = (auVar298._0_4_ * (fVar123 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar250 = (auVar298._4_4_ * (fVar144 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar252 = (auVar298._8_4_ * (fVar146 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar254 = (auVar298._12_4_ * (fVar149 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar255 = (auVar298._16_4_ * (fVar190 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar256 = (auVar298._20_4_ * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar257 = (auVar298._24_4_ * (fVar212 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar311 = -fVar123 * auVar206._0_4_ * auVar206._0_4_ * 0.5;
    fVar317 = -fVar144 * auVar206._4_4_ * auVar206._4_4_ * 0.5;
    fVar322 = -fVar146 * auVar206._8_4_ * auVar206._8_4_ * 0.5;
    fVar327 = -fVar149 * auVar206._12_4_ * auVar206._12_4_ * 0.5;
    fVar332 = -fVar190 * auVar206._16_4_ * auVar206._16_4_ * 0.5;
    fVar336 = -fVar211 * auVar206._20_4_ * auVar206._20_4_ * 0.5;
    fVar340 = -fVar212 * auVar206._24_4_ * auVar206._24_4_ * 0.5;
    fVar237 = auVar260._0_4_;
    fVar238 = auVar260._4_4_;
    fVar401 = auVar260._8_4_;
    fVar369 = auVar260._12_4_;
    fVar174 = auVar18._0_4_;
    fVar177 = auVar18._4_4_;
    fVar180 = auVar18._8_4_;
    fVar215 = local_400._28_4_;
    fVar359 = auVar358._28_4_ + fVar215;
    fVar378 = (auVar161._0_4_ * (fVar234 + -5.0) + 2.0) * 0.5;
    fVar384 = (auVar161._4_4_ * (fVar235 + -5.0) + 2.0) * 0.5;
    fVar386 = (auVar161._8_4_ * (fVar236 + -5.0) + 2.0) * 0.5;
    fVar388 = (auVar161._12_4_ * (fVar240 + -5.0) + 2.0) * 0.5;
    fVar390 = (auVar161._16_4_ * (fVar249 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar161._20_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar396 = (auVar161._24_4_ * (fVar239 + -5.0) + 2.0) * 0.5;
    fVar360 = -auVar206._0_4_ * fVar123 * fVar123 * 0.5;
    fVar365 = -auVar206._4_4_ * fVar144 * fVar144 * 0.5;
    fVar367 = -auVar206._8_4_ * fVar146 * fVar146 * 0.5;
    fVar370 = -auVar206._12_4_ * fVar149 * fVar149 * 0.5;
    fVar372 = -auVar206._16_4_ * fVar190 * fVar190 * 0.5;
    fVar374 = -auVar206._20_4_ * fVar211 * fVar211 * 0.5;
    fVar376 = -auVar206._24_4_ * fVar212 * fVar212 * 0.5;
    fVar312 = fVar360 * (float)local_1e0._0_4_ +
              fVar378 * (float)local_320._0_4_ + fVar237 * fVar311 + local_400._0_4_ * fVar253;
    fVar318 = fVar365 * (float)local_1e0._4_4_ +
              fVar384 * (float)local_320._4_4_ + fVar238 * fVar317 + local_400._4_4_ * fVar250;
    fVar323 = fVar367 * fStack_1d8 +
              fVar386 * fStack_318 + fVar401 * fVar322 + local_400._8_4_ * fVar252;
    fVar328 = fVar370 * fStack_1d4 +
              fVar388 * fStack_314 + fVar369 * fVar327 + local_400._12_4_ * fVar254;
    fVar333 = fVar372 * fStack_1d0 +
              fVar390 * fStack_310 + fVar237 * fVar332 + local_400._16_4_ * fVar255;
    fVar337 = fVar374 * fStack_1cc +
              fVar393 * fStack_30c + fVar238 * fVar336 + local_400._20_4_ * fVar256;
    fVar341 = fVar376 * fStack_1c8 +
              fVar396 * fStack_308 + fVar401 * fVar340 + local_400._24_4_ * fVar257;
    fVar344 = fVar215 + 2.0 + -fVar213 + fVar215 + -0.0;
    fVar313 = (float)local_200._0_4_ * fVar360 +
              fVar378 * (float)local_340._0_4_ +
              fVar174 * fVar311 + fVar253 * (float)local_380._0_4_;
    fVar319 = (float)local_200._4_4_ * fVar365 +
              fVar384 * (float)local_340._4_4_ +
              fVar177 * fVar317 + fVar250 * (float)local_380._4_4_;
    fVar324 = fStack_1f8 * fVar367 + fVar386 * fStack_338 + fVar180 * fVar322 + fVar252 * fStack_378
    ;
    fVar329 = fStack_1f4 * fVar370 +
              fVar388 * fStack_334 + auVar18._12_4_ * fVar327 + fVar254 * fStack_374;
    fStack_7b0 = fStack_1f0 * fVar372 +
                 fVar390 * fStack_330 + fVar174 * fVar332 + fVar255 * fStack_370;
    fStack_7ac = fStack_1ec * fVar374 +
                 fVar393 * fStack_32c + fVar177 * fVar336 + fVar256 * fStack_36c;
    fStack_7a8 = fStack_1e8 * fVar376 +
                 fVar396 * fStack_328 + fVar180 * fVar340 + fVar257 * fStack_368;
    fStack_7a4 = fVar344 + fVar215 + -0.0 + fVar359;
    fVar150 = (float)local_220._0_4_ * fVar360 +
              fVar378 * (float)local_360._0_4_ +
              fVar311 * (float)local_3e0._0_4_ + fVar253 * (float)local_3a0._0_4_;
    fVar171 = (float)local_220._4_4_ * fVar365 +
              fVar384 * (float)local_360._4_4_ +
              fVar317 * (float)local_3e0._4_4_ + fVar250 * (float)local_3a0._4_4_;
    fVar172 = fStack_218 * fVar367 +
              fVar386 * fStack_358 + fVar322 * fStack_3d8 + fVar252 * fStack_398;
    fVar175 = fStack_214 * fVar370 +
              fVar388 * fStack_354 + fVar327 * fStack_3d4 + fVar254 * fStack_394;
    fVar178 = fStack_210 * fVar372 +
              fVar390 * fStack_350 + fVar332 * fStack_3d0 + fVar255 * fStack_390;
    fVar181 = fStack_20c * fVar374 +
              fVar393 * fStack_34c + fVar336 * fStack_3cc + fVar256 * fStack_38c;
    fVar184 = fStack_208 * fVar376 +
              fVar396 * fStack_348 + fVar340 * fStack_3c8 + fVar257 * fStack_388;
    fVar187 = fStack_7a4 + fVar359 + fVar369 + fVar215;
    local_6e0._0_4_ =
         fVar360 * (float)local_240._0_4_ +
         (float)local_260._0_4_ * fVar378 +
         (float)local_2a0._0_4_ * fVar311 + fVar253 * (float)local_3c0._0_4_;
    local_6e0._4_4_ =
         fVar365 * (float)local_240._4_4_ +
         (float)local_260._4_4_ * fVar384 +
         (float)local_2a0._4_4_ * fVar317 + fVar250 * (float)local_3c0._4_4_;
    local_6e0._8_4_ =
         fVar367 * fStack_238 + fStack_258 * fVar386 + fStack_298 * fVar322 + fVar252 * fStack_3b8;
    local_6e0._12_4_ =
         fVar370 * fStack_234 + fStack_254 * fVar388 + fStack_294 * fVar327 + fVar254 * fStack_3b4;
    local_6e0._16_4_ =
         fVar372 * fStack_230 + fStack_250 * fVar390 + fStack_290 * fVar332 + fVar255 * fStack_3b0;
    local_6e0._20_4_ =
         fVar374 * fStack_22c + fStack_24c * fVar393 + fStack_28c * fVar336 + fVar256 * fStack_3ac;
    local_6e0._24_4_ =
         fVar376 * fStack_228 + fStack_248 * fVar396 + fStack_288 * fVar340 + fVar257 * fStack_3a8;
    local_6e0._28_4_ = fStack_7a4 + fVar215 + 2.0 + -fVar213 + fVar411 + -5.0 + 2.0;
    fVar367 = auVar206._28_4_ + auVar206._28_4_;
    auVar25._4_4_ = (fVar144 + fVar144) * auVar206._4_4_;
    auVar25._0_4_ = (fVar123 + fVar123) * auVar206._0_4_;
    auVar25._8_4_ = (fVar146 + fVar146) * auVar206._8_4_;
    auVar25._12_4_ = (fVar149 + fVar149) * auVar206._12_4_;
    auVar25._16_4_ = (fVar190 + fVar190) * auVar206._16_4_;
    auVar25._20_4_ = (fVar211 + fVar211) * auVar206._20_4_;
    auVar25._24_4_ = (fVar212 + fVar212) * auVar206._24_4_;
    auVar25._28_4_ = fVar367;
    auVar113 = vsubps_avx(auVar25,auVar298._0_32_);
    auVar22._4_4_ = (fVar144 + fVar144) * (fVar235 + 2.0);
    auVar22._0_4_ = (fVar123 + fVar123) * (fVar234 + 2.0);
    auVar22._8_4_ = (fVar146 + fVar146) * (fVar236 + 2.0);
    auVar22._12_4_ = (fVar149 + fVar149) * (fVar240 + 2.0);
    auVar22._16_4_ = (fVar190 + fVar190) * (fVar249 + 2.0);
    auVar22._20_4_ = (fVar211 + fVar211) * (fVar251 + 2.0);
    auVar22._24_4_ = (fVar212 + fVar212) * (fVar239 + 2.0);
    auVar22._28_4_ = 0x40400000;
    auVar23._4_4_ = fVar144 * fVar144 * 3.0;
    auVar23._0_4_ = fVar123 * fVar123 * 3.0;
    auVar23._8_4_ = fVar146 * fVar146 * 3.0;
    auVar23._12_4_ = fVar149 * fVar149 * 3.0;
    auVar23._16_4_ = fVar190 * fVar190 * 3.0;
    auVar23._20_4_ = fVar211 * fVar211 * 3.0;
    auVar23._24_4_ = fVar212 * fVar212 * 3.0;
    auVar23._28_4_ = fVar213;
    auVar114 = vsubps_avx(auVar22,auVar23);
    auVar25 = vsubps_avx(auVar161,auVar25);
    fVar327 = auVar113._0_4_ * 0.5;
    fVar332 = auVar113._4_4_ * 0.5;
    fVar336 = auVar113._8_4_ * 0.5;
    fVar340 = auVar113._12_4_ * 0.5;
    fVar359 = auVar113._16_4_ * 0.5;
    fVar360 = auVar113._20_4_ * 0.5;
    fVar365 = auVar113._24_4_ * 0.5;
    fVar253 = (auVar206._0_4_ * fVar234 + (auVar206._0_4_ + auVar206._0_4_) * (fVar234 + -5.0)) *
              0.5;
    fVar255 = (auVar206._4_4_ * fVar235 + (auVar206._4_4_ + auVar206._4_4_) * (fVar235 + -5.0)) *
              0.5;
    fVar256 = (auVar206._8_4_ * fVar236 + (auVar206._8_4_ + auVar206._8_4_) * (fVar236 + -5.0)) *
              0.5;
    fVar257 = (auVar206._12_4_ * fVar240 + (auVar206._12_4_ + auVar206._12_4_) * (fVar240 + -5.0)) *
              0.5;
    fVar311 = (auVar206._16_4_ * fVar249 + (auVar206._16_4_ + auVar206._16_4_) * (fVar249 + -5.0)) *
              0.5;
    fVar317 = (auVar206._20_4_ * fVar251 + (auVar206._20_4_ + auVar206._20_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar322 = (auVar206._24_4_ * fVar239 + (auVar206._24_4_ + auVar206._24_4_) * (fVar239 + -5.0)) *
              0.5;
    fVar123 = auVar114._0_4_ * 0.5;
    fVar144 = auVar114._4_4_ * 0.5;
    fVar146 = auVar114._8_4_ * 0.5;
    fVar149 = auVar114._12_4_ * 0.5;
    fVar212 = auVar114._16_4_ * 0.5;
    fVar215 = auVar114._20_4_ * 0.5;
    fVar236 = auVar114._24_4_ * 0.5;
    fVar211 = auVar25._0_4_ * 0.5;
    fVar235 = auVar25._4_4_ * 0.5;
    fVar240 = auVar25._8_4_ * 0.5;
    fVar249 = auVar25._12_4_ * 0.5;
    fVar239 = auVar25._16_4_ * 0.5;
    fVar250 = auVar25._20_4_ * 0.5;
    fVar252 = auVar25._24_4_ * 0.5;
    fVar188 = auVar206._28_4_ + -4.0 + auVar25._28_4_ + fVar213 + fVar213 + 0.5;
    auVar223 = vpermilps_avx(ZEXT416((uint)(auVar108._0_4_ * 0.04761905)),0);
    fVar190 = auVar223._0_4_;
    fVar361 = fVar190 * ((float)local_1e0._0_4_ * fVar327 +
                        fVar253 * (float)local_320._0_4_ +
                        fVar123 * local_400._0_4_ + fVar211 * fVar237);
    fVar234 = auVar223._4_4_;
    fVar366 = fVar234 * ((float)local_1e0._4_4_ * fVar332 +
                        fVar255 * (float)local_320._4_4_ +
                        fVar144 * local_400._4_4_ + fVar235 * fVar238);
    local_7e0._4_4_ = fVar366;
    local_7e0._0_4_ = fVar361;
    fVar251 = auVar223._8_4_;
    fVar368 = fVar251 * (fStack_1d8 * fVar336 +
                        fVar256 * fStack_318 + fVar146 * local_400._8_4_ + fVar240 * fVar401);
    local_7e0._8_4_ = fVar368;
    fVar254 = auVar223._12_4_;
    fVar371 = fVar254 * (fStack_1d4 * fVar340 +
                        fVar257 * fStack_314 + fVar149 * local_400._12_4_ + fVar249 * fVar369);
    local_7e0._12_4_ = fVar371;
    fVar373 = fVar190 * (fStack_1d0 * fVar359 +
                        fVar311 * fStack_310 + fVar212 * local_400._16_4_ + fVar239 * fVar237);
    local_7e0._16_4_ = fVar373;
    fVar375 = fVar234 * (fStack_1cc * fVar360 +
                        fVar317 * fStack_30c + fVar215 * local_400._20_4_ + fVar250 * fVar238);
    local_7e0._20_4_ = fVar375;
    fVar377 = fVar251 * (fStack_1c8 * fVar365 +
                        fVar322 * fStack_308 + fVar236 * local_400._24_4_ + fVar252 * fVar401);
    local_7e0._24_4_ = fVar377;
    local_7e0._28_4_ = uStack_224;
    fVar388 = fVar190 * ((float)local_200._0_4_ * fVar327 +
                        fVar253 * (float)local_340._0_4_ +
                        fVar123 * (float)local_380._0_4_ + fVar211 * fVar174);
    fVar393 = fVar234 * ((float)local_200._4_4_ * fVar332 +
                        fVar255 * (float)local_340._4_4_ +
                        fVar144 * (float)local_380._4_4_ + fVar235 * fVar177);
    auVar33._4_4_ = fVar393;
    auVar33._0_4_ = fVar388;
    fVar173 = fVar251 * (fStack_1f8 * fVar336 +
                        fVar256 * fStack_338 + fVar146 * fStack_378 + fVar240 * fVar180);
    auVar33._8_4_ = fVar173;
    fVar176 = fVar254 * (fStack_1f4 * fVar340 +
                        fVar257 * fStack_334 + fVar149 * fStack_374 + fVar249 * auVar18._12_4_);
    auVar33._12_4_ = fVar176;
    fVar179 = fVar190 * (fStack_1f0 * fVar359 +
                        fVar311 * fStack_330 + fVar212 * fStack_370 + fVar239 * fVar174);
    auVar33._16_4_ = fVar179;
    fVar182 = fVar234 * (fStack_1ec * fVar360 +
                        fVar317 * fStack_32c + fVar215 * fStack_36c + fVar250 * fVar177);
    auVar33._20_4_ = fVar182;
    fVar185 = fVar251 * (fStack_1e8 * fVar365 +
                        fVar322 * fStack_328 + fVar236 * fStack_368 + fVar252 * fVar180);
    auVar33._24_4_ = fVar185;
    auVar33._28_4_ = fVar188;
    fVar314 = fVar190 * ((float)local_220._0_4_ * fVar327 +
                        fVar123 * (float)local_3a0._0_4_ + fVar211 * (float)local_3e0._0_4_ +
                        fVar253 * (float)local_360._0_4_);
    fVar320 = fVar234 * ((float)local_220._4_4_ * fVar332 +
                        fVar144 * (float)local_3a0._4_4_ + fVar235 * (float)local_3e0._4_4_ +
                        fVar255 * (float)local_360._4_4_);
    auVar30._4_4_ = fVar320;
    auVar30._0_4_ = fVar314;
    fVar325 = fVar251 * (fStack_218 * fVar336 +
                        fVar146 * fStack_398 + fVar240 * fStack_3d8 + fVar256 * fStack_358);
    auVar30._8_4_ = fVar325;
    fVar330 = fVar254 * (fStack_214 * fVar340 +
                        fVar149 * fStack_394 + fVar249 * fStack_3d4 + fVar257 * fStack_354);
    auVar30._12_4_ = fVar330;
    fVar334 = fVar190 * (fStack_210 * fVar359 +
                        fVar212 * fStack_390 + fVar239 * fStack_3d0 + fVar311 * fStack_350);
    auVar30._16_4_ = fVar334;
    fVar338 = fVar234 * (fStack_20c * fVar360 +
                        fVar215 * fStack_38c + fVar250 * fStack_3cc + fVar317 * fStack_34c);
    auVar30._20_4_ = fVar338;
    fVar342 = fVar251 * (fStack_208 * fVar365 +
                        fVar236 * fStack_388 + fVar252 * fStack_3c8 + fVar322 * fStack_348);
    auVar30._24_4_ = fVar342;
    auVar30._28_4_ = fVar213 + fVar213;
    fVar211 = fVar190 * ((float)local_240._0_4_ * fVar327 +
                        (float)local_260._0_4_ * fVar253 +
                        fVar123 * (float)local_3c0._0_4_ + (float)local_2a0._0_4_ * fVar211);
    fVar235 = fVar234 * ((float)local_240._4_4_ * fVar332 +
                        (float)local_260._4_4_ * fVar255 +
                        fVar144 * (float)local_3c0._4_4_ + (float)local_2a0._4_4_ * fVar235);
    auVar24._4_4_ = fVar235;
    auVar24._0_4_ = fVar211;
    fVar253 = fVar251 * (fStack_238 * fVar336 +
                        fStack_258 * fVar256 + fVar146 * fStack_3b8 + fStack_298 * fVar240);
    auVar24._8_4_ = fVar253;
    fVar255 = fVar254 * (fStack_234 * fVar340 +
                        fStack_254 * fVar257 + fVar149 * fStack_3b4 + fStack_294 * fVar249);
    auVar24._12_4_ = fVar255;
    fVar190 = fVar190 * (fStack_230 * fVar359 +
                        fStack_250 * fVar311 + fVar212 * fStack_3b0 + fStack_290 * fVar239);
    auVar24._16_4_ = fVar190;
    fVar234 = fVar234 * (fStack_22c * fVar360 +
                        fStack_24c * fVar317 + fVar215 * fStack_3ac + fStack_28c * fVar250);
    auVar24._20_4_ = fVar234;
    fVar251 = fVar251 * (fStack_228 * fVar365 +
                        fStack_248 * fVar322 + fVar236 * fStack_3a8 + fStack_288 * fVar252);
    auVar24._24_4_ = fVar251;
    auVar24._28_4_ = fVar254;
    auVar83._4_4_ = fVar319;
    auVar83._0_4_ = fVar313;
    auVar83._8_4_ = fVar324;
    auVar83._12_4_ = fVar329;
    auVar83._16_4_ = fStack_7b0;
    auVar83._20_4_ = fStack_7ac;
    auVar83._24_4_ = fStack_7a8;
    auVar83._28_4_ = fStack_7a4;
    auVar113 = vperm2f128_avx(auVar83,auVar83,1);
    auVar113 = vshufps_avx(auVar113,auVar83,0x30);
    auVar22 = vshufps_avx(auVar83,auVar113,0x29);
    auVar77._4_4_ = fVar171;
    auVar77._0_4_ = fVar150;
    auVar77._8_4_ = fVar172;
    auVar77._12_4_ = fVar175;
    auVar77._16_4_ = fVar178;
    auVar77._20_4_ = fVar181;
    auVar77._24_4_ = fVar184;
    auVar77._28_4_ = fVar187;
    auVar113 = vperm2f128_avx(auVar77,auVar77,1);
    auVar113 = vshufps_avx(auVar113,auVar77,0x30);
    auVar23 = vshufps_avx(auVar77,auVar113,0x29);
    auVar114 = vsubps_avx(local_6e0,auVar24);
    auVar113 = vperm2f128_avx(auVar114,auVar114,1);
    auVar113 = vshufps_avx(auVar113,auVar114,0x30);
    auVar24 = vshufps_avx(auVar114,auVar113,0x29);
    auVar26 = vsubps_avx(auVar22,auVar83);
    auVar25 = vsubps_avx(auVar23,auVar77);
    fVar144 = auVar26._0_4_;
    fVar212 = auVar26._4_4_;
    auVar28._4_4_ = fVar320 * fVar212;
    auVar28._0_4_ = fVar314 * fVar144;
    fVar236 = auVar26._8_4_;
    auVar28._8_4_ = fVar325 * fVar236;
    fVar239 = auVar26._12_4_;
    auVar28._12_4_ = fVar330 * fVar239;
    fVar256 = auVar26._16_4_;
    auVar28._16_4_ = fVar334 * fVar256;
    fVar327 = auVar26._20_4_;
    auVar28._20_4_ = fVar338 * fVar327;
    fVar360 = auVar26._24_4_;
    auVar28._24_4_ = fVar342 * fVar360;
    auVar28._28_4_ = auVar114._28_4_;
    fVar292 = auVar25._0_4_;
    fVar299 = auVar25._4_4_;
    auVar27._4_4_ = fVar299 * fVar393;
    auVar27._0_4_ = fVar292 * fVar388;
    fVar301 = auVar25._8_4_;
    auVar27._8_4_ = fVar301 * fVar173;
    fVar303 = auVar25._12_4_;
    auVar27._12_4_ = fVar303 * fVar176;
    fVar305 = auVar25._16_4_;
    auVar27._16_4_ = fVar305 * fVar179;
    fVar307 = auVar25._20_4_;
    auVar27._20_4_ = fVar307 * fVar182;
    fVar309 = auVar25._24_4_;
    auVar27._24_4_ = fVar309 * fVar185;
    auVar27._28_4_ = auVar113._28_4_;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar79._4_4_ = fVar318;
    auVar79._0_4_ = fVar312;
    auVar79._8_4_ = fVar323;
    auVar79._12_4_ = fVar328;
    auVar79._16_4_ = fVar333;
    auVar79._20_4_ = fVar337;
    auVar79._24_4_ = fVar341;
    auVar79._28_4_ = fVar344;
    auVar113 = vperm2f128_avx(auVar79,auVar79,1);
    auVar113 = vshufps_avx(auVar113,auVar79,0x30);
    local_9a0 = vshufps_avx(auVar79,auVar113,0x29);
    auVar27 = vsubps_avx(local_9a0,auVar79);
    auVar29._4_4_ = fVar366 * fVar299;
    auVar29._0_4_ = fVar361 * fVar292;
    auVar29._8_4_ = fVar368 * fVar301;
    auVar29._12_4_ = fVar371 * fVar303;
    auVar29._16_4_ = fVar373 * fVar305;
    auVar29._20_4_ = fVar375 * fVar307;
    auVar29._24_4_ = fVar377 * fVar309;
    auVar29._28_4_ = local_9a0._28_4_;
    fVar146 = auVar27._0_4_;
    fVar213 = auVar27._4_4_;
    auVar245._4_4_ = fVar320 * fVar213;
    auVar245._0_4_ = fVar314 * fVar146;
    fVar240 = auVar27._8_4_;
    auVar245._8_4_ = fVar325 * fVar240;
    fVar250 = auVar27._12_4_;
    auVar245._12_4_ = fVar330 * fVar250;
    fVar257 = auVar27._16_4_;
    auVar245._16_4_ = fVar334 * fVar257;
    fVar332 = auVar27._20_4_;
    auVar245._20_4_ = fVar338 * fVar332;
    fVar365 = auVar27._24_4_;
    auVar245._24_4_ = fVar342 * fVar365;
    auVar245._28_4_ = fVar344;
    auVar28 = vsubps_avx(auVar245,auVar29);
    auVar31._4_4_ = fVar393 * fVar213;
    auVar31._0_4_ = fVar388 * fVar146;
    auVar31._8_4_ = fVar173 * fVar240;
    auVar31._12_4_ = fVar176 * fVar250;
    auVar31._16_4_ = fVar179 * fVar257;
    auVar31._20_4_ = fVar182 * fVar332;
    auVar31._24_4_ = fVar185 * fVar365;
    auVar31._28_4_ = fVar344;
    auVar32._4_4_ = fVar366 * fVar212;
    auVar32._0_4_ = fVar361 * fVar144;
    auVar32._8_4_ = fVar368 * fVar236;
    auVar32._12_4_ = fVar371 * fVar239;
    auVar32._16_4_ = fVar373 * fVar256;
    auVar32._20_4_ = fVar375 * fVar327;
    auVar32._24_4_ = fVar377 * fVar360;
    auVar32._28_4_ = fVar367;
    auVar29 = vsubps_avx(auVar32,auVar31);
    fVar123 = auVar29._28_4_;
    fVar317 = auVar28._28_4_ + fVar123;
    auVar207._0_4_ = fVar146 * fVar146 + fVar144 * fVar144 + fVar292 * fVar292;
    auVar207._4_4_ = fVar213 * fVar213 + fVar212 * fVar212 + fVar299 * fVar299;
    auVar207._8_4_ = fVar240 * fVar240 + fVar236 * fVar236 + fVar301 * fVar301;
    auVar207._12_4_ = fVar250 * fVar250 + fVar239 * fVar239 + fVar303 * fVar303;
    auVar207._16_4_ = fVar257 * fVar257 + fVar256 * fVar256 + fVar305 * fVar305;
    auVar207._20_4_ = fVar332 * fVar332 + fVar327 * fVar327 + fVar307 * fVar307;
    auVar207._24_4_ = fVar365 * fVar365 + fVar360 * fVar360 + fVar309 * fVar309;
    auVar207._28_4_ = fVar123 + fVar123 + fVar317;
    auVar113 = vrcpps_avx(auVar207);
    fVar322 = auVar113._0_4_;
    fVar340 = auVar113._4_4_;
    auVar34._4_4_ = fVar340 * auVar207._4_4_;
    auVar34._0_4_ = fVar322 * auVar207._0_4_;
    fVar359 = auVar113._8_4_;
    auVar34._8_4_ = fVar359 * auVar207._8_4_;
    fVar237 = auVar113._12_4_;
    auVar34._12_4_ = fVar237 * auVar207._12_4_;
    fVar238 = auVar113._16_4_;
    auVar34._16_4_ = fVar238 * auVar207._16_4_;
    fVar370 = auVar113._20_4_;
    auVar34._20_4_ = fVar370 * auVar207._20_4_;
    fVar372 = auVar113._24_4_;
    auVar34._24_4_ = fVar372 * auVar207._24_4_;
    auVar34._28_4_ = fVar367;
    auVar354._8_4_ = 0x3f800000;
    auVar354._0_8_ = 0x3f8000003f800000;
    auVar354._12_4_ = 0x3f800000;
    auVar354._16_4_ = 0x3f800000;
    auVar354._20_4_ = 0x3f800000;
    auVar354._24_4_ = 0x3f800000;
    auVar354._28_4_ = 0x3f800000;
    auVar245 = vsubps_avx(auVar354,auVar34);
    fVar322 = auVar245._0_4_ * fVar322 + fVar322;
    fVar340 = auVar245._4_4_ * fVar340 + fVar340;
    fVar359 = auVar245._8_4_ * fVar359 + fVar359;
    fVar237 = auVar245._12_4_ * fVar237 + fVar237;
    fVar238 = auVar245._16_4_ * fVar238 + fVar238;
    fVar370 = auVar245._20_4_ * fVar370 + fVar370;
    fVar372 = auVar245._24_4_ * fVar372 + fVar372;
    auVar114 = vperm2f128_avx(auVar33,auVar33,1);
    auVar114 = vshufps_avx(auVar114,auVar33,0x30);
    local_800 = vshufps_avx(auVar33,auVar114,0x29);
    auVar114 = vperm2f128_avx(auVar30,auVar30,1);
    auVar114 = vshufps_avx(auVar114,auVar30,0x30);
    local_9c0 = vshufps_avx(auVar30,auVar114,0x29);
    fVar379 = local_9c0._0_4_;
    fVar385 = local_9c0._4_4_;
    auVar35._4_4_ = fVar385 * fVar212;
    auVar35._0_4_ = fVar379 * fVar144;
    fVar387 = local_9c0._8_4_;
    auVar35._8_4_ = fVar387 * fVar236;
    fVar389 = local_9c0._12_4_;
    auVar35._12_4_ = fVar389 * fVar239;
    fVar391 = local_9c0._16_4_;
    auVar35._16_4_ = fVar391 * fVar256;
    fVar394 = local_9c0._20_4_;
    auVar35._20_4_ = fVar394 * fVar327;
    fVar397 = local_9c0._24_4_;
    auVar35._24_4_ = fVar397 * fVar360;
    auVar35._28_4_ = auVar114._28_4_;
    fVar149 = local_800._0_4_;
    fVar215 = local_800._4_4_;
    auVar36._4_4_ = fVar299 * fVar215;
    auVar36._0_4_ = fVar292 * fVar149;
    fVar249 = local_800._8_4_;
    auVar36._8_4_ = fVar301 * fVar249;
    fVar252 = local_800._12_4_;
    auVar36._12_4_ = fVar303 * fVar252;
    fVar311 = local_800._16_4_;
    auVar36._16_4_ = fVar305 * fVar311;
    fVar336 = local_800._20_4_;
    auVar36._20_4_ = fVar307 * fVar336;
    fVar367 = local_800._24_4_;
    auVar36._24_4_ = fVar309 * fVar367;
    auVar36._28_4_ = 0x3f800000;
    auVar30 = vsubps_avx(auVar36,auVar35);
    auVar114 = vperm2f128_avx(local_7e0,local_7e0,1);
    auVar114 = vshufps_avx(auVar114,local_7e0,0x30);
    local_820 = vshufps_avx(local_7e0,auVar114,0x29);
    fVar315 = local_820._0_4_;
    fVar321 = local_820._4_4_;
    auVar37._4_4_ = fVar321 * fVar299;
    auVar37._0_4_ = fVar315 * fVar292;
    fVar326 = local_820._8_4_;
    auVar37._8_4_ = fVar326 * fVar301;
    fVar331 = local_820._12_4_;
    auVar37._12_4_ = fVar331 * fVar303;
    fVar335 = local_820._16_4_;
    auVar37._16_4_ = fVar335 * fVar305;
    fVar339 = local_820._20_4_;
    auVar37._20_4_ = fVar339 * fVar307;
    fVar343 = local_820._24_4_;
    auVar37._24_4_ = fVar343 * fVar309;
    auVar37._28_4_ = auVar114._28_4_;
    auVar38._4_4_ = fVar385 * fVar213;
    auVar38._0_4_ = fVar379 * fVar146;
    auVar38._8_4_ = fVar387 * fVar240;
    auVar38._12_4_ = fVar389 * fVar250;
    auVar38._16_4_ = fVar391 * fVar257;
    auVar38._20_4_ = fVar394 * fVar332;
    auVar38._24_4_ = fVar397 * fVar365;
    auVar38._28_4_ = uStack_224;
    auVar31 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar215 * fVar213;
    auVar39._0_4_ = fVar149 * fVar146;
    auVar39._8_4_ = fVar249 * fVar240;
    auVar39._12_4_ = fVar252 * fVar250;
    auVar39._16_4_ = fVar311 * fVar257;
    auVar39._20_4_ = fVar336 * fVar332;
    auVar39._24_4_ = fVar367 * fVar365;
    auVar39._28_4_ = uStack_224;
    auVar40._4_4_ = fVar321 * fVar212;
    auVar40._0_4_ = fVar315 * fVar144;
    auVar40._8_4_ = fVar326 * fVar236;
    auVar40._12_4_ = fVar331 * fVar239;
    auVar40._16_4_ = fVar335 * fVar256;
    auVar40._20_4_ = fVar339 * fVar327;
    fVar401 = local_9c0._28_4_;
    auVar40._24_4_ = fVar343 * fVar360;
    auVar40._28_4_ = fVar401;
    auVar114 = vsubps_avx(auVar40,auVar39);
    fVar123 = auVar114._28_4_;
    auVar41._4_4_ =
         (auVar25._4_4_ * auVar25._4_4_ +
         auVar28._4_4_ * auVar28._4_4_ + auVar29._4_4_ * auVar29._4_4_) * fVar340;
    auVar41._0_4_ =
         (auVar25._0_4_ * auVar25._0_4_ +
         auVar28._0_4_ * auVar28._0_4_ + auVar29._0_4_ * auVar29._0_4_) * fVar322;
    auVar41._8_4_ =
         (auVar25._8_4_ * auVar25._8_4_ +
         auVar28._8_4_ * auVar28._8_4_ + auVar29._8_4_ * auVar29._8_4_) * fVar359;
    auVar41._12_4_ =
         (auVar25._12_4_ * auVar25._12_4_ +
         auVar28._12_4_ * auVar28._12_4_ + auVar29._12_4_ * auVar29._12_4_) * fVar237;
    auVar41._16_4_ =
         (auVar25._16_4_ * auVar25._16_4_ +
         auVar28._16_4_ * auVar28._16_4_ + auVar29._16_4_ * auVar29._16_4_) * fVar238;
    auVar41._20_4_ =
         (auVar25._20_4_ * auVar25._20_4_ +
         auVar28._20_4_ * auVar28._20_4_ + auVar29._20_4_ * auVar29._20_4_) * fVar370;
    auVar41._24_4_ =
         (auVar25._24_4_ * auVar25._24_4_ +
         auVar28._24_4_ * auVar28._24_4_ + auVar29._24_4_ * auVar29._24_4_) * fVar372;
    auVar41._28_4_ = auVar25._28_4_ + fVar317;
    auVar42._4_4_ =
         (auVar30._4_4_ * auVar30._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar114._4_4_ * auVar114._4_4_) * fVar340;
    auVar42._0_4_ =
         (auVar30._0_4_ * auVar30._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar114._0_4_ * auVar114._0_4_) * fVar322;
    auVar42._8_4_ =
         (auVar30._8_4_ * auVar30._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar114._8_4_ * auVar114._8_4_) * fVar359;
    auVar42._12_4_ =
         (auVar30._12_4_ * auVar30._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar114._12_4_ * auVar114._12_4_) * fVar237;
    auVar42._16_4_ =
         (auVar30._16_4_ * auVar30._16_4_ +
         auVar31._16_4_ * auVar31._16_4_ + auVar114._16_4_ * auVar114._16_4_) * fVar238;
    auVar42._20_4_ =
         (auVar30._20_4_ * auVar30._20_4_ +
         auVar31._20_4_ * auVar31._20_4_ + auVar114._20_4_ * auVar114._20_4_) * fVar370;
    auVar42._24_4_ =
         (auVar30._24_4_ * auVar30._24_4_ +
         auVar31._24_4_ * auVar31._24_4_ + auVar114._24_4_ * auVar114._24_4_) * fVar372;
    auVar42._28_4_ = auVar245._28_4_ + auVar113._28_4_;
    auVar113 = vmaxps_avx(auVar41,auVar42);
    auVar114 = vperm2f128_avx(local_6e0,local_6e0,1);
    auVar114 = vshufps_avx(auVar114,local_6e0,0x30);
    auVar28 = vshufps_avx(local_6e0,auVar114,0x29);
    auVar115._0_4_ = (float)local_6e0._0_4_ + fVar211;
    auVar115._4_4_ = local_6e0._4_4_ + fVar235;
    auVar115._8_4_ = local_6e0._8_4_ + fVar253;
    auVar115._12_4_ = local_6e0._12_4_ + fVar255;
    auVar115._16_4_ = local_6e0._16_4_ + fVar190;
    auVar115._20_4_ = local_6e0._20_4_ + fVar234;
    auVar115._24_4_ = local_6e0._24_4_ + fVar251;
    auVar115._28_4_ = local_6e0._28_4_ + fVar254;
    auVar114 = vmaxps_avx(local_6e0,auVar115);
    auVar25 = vmaxps_avx(auVar24,auVar28);
    auVar114 = vmaxps_avx(auVar114,auVar25);
    auVar25 = vrsqrtps_avx(auVar207);
    fVar190 = auVar25._0_4_;
    fVar211 = auVar25._4_4_;
    fVar234 = auVar25._8_4_;
    fVar235 = auVar25._12_4_;
    fVar251 = auVar25._16_4_;
    fVar253 = auVar25._20_4_;
    fVar254 = auVar25._24_4_;
    auVar43._4_4_ = fVar211 * fVar211 * fVar211 * auVar207._4_4_ * 0.5;
    auVar43._0_4_ = fVar190 * fVar190 * fVar190 * auVar207._0_4_ * 0.5;
    auVar43._8_4_ = fVar234 * fVar234 * fVar234 * auVar207._8_4_ * 0.5;
    auVar43._12_4_ = fVar235 * fVar235 * fVar235 * auVar207._12_4_ * 0.5;
    auVar43._16_4_ = fVar251 * fVar251 * fVar251 * auVar207._16_4_ * 0.5;
    auVar43._20_4_ = fVar253 * fVar253 * fVar253 * auVar207._20_4_ * 0.5;
    auVar43._24_4_ = fVar254 * fVar254 * fVar254 * auVar207._24_4_ * 0.5;
    auVar43._28_4_ = auVar207._28_4_;
    auVar44._4_4_ = fVar211 * 1.5;
    auVar44._0_4_ = fVar190 * 1.5;
    auVar44._8_4_ = fVar234 * 1.5;
    auVar44._12_4_ = fVar235 * 1.5;
    auVar44._16_4_ = fVar251 * 1.5;
    auVar44._20_4_ = fVar253 * 1.5;
    auVar44._24_4_ = fVar254 * 1.5;
    auVar44._28_4_ = auVar25._28_4_;
    auVar29 = vsubps_avx(auVar44,auVar43);
    auVar245 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_840 = vsubps_avx(auVar245,auVar83);
    auVar78._4_4_ = fVar171;
    auVar78._0_4_ = fVar150;
    auVar78._8_4_ = fVar172;
    auVar78._12_4_ = fVar175;
    auVar78._16_4_ = fVar178;
    auVar78._20_4_ = fVar181;
    auVar78._24_4_ = fVar184;
    auVar78._28_4_ = fVar187;
    local_860 = vsubps_avx(auVar245,auVar78);
    fVar400 = local_860._0_4_;
    fVar404 = local_860._4_4_;
    fVar406 = local_860._8_4_;
    fVar408 = local_860._12_4_;
    fVar410 = local_860._16_4_;
    fVar412 = local_860._20_4_;
    fVar414 = local_860._24_4_;
    fVar190 = local_840._0_4_;
    fVar234 = local_840._4_4_;
    fVar251 = local_840._8_4_;
    fVar254 = local_840._12_4_;
    fVar317 = local_840._16_4_;
    fVar340 = local_840._20_4_;
    fVar237 = local_840._24_4_;
    auVar80._4_4_ = fVar318;
    auVar80._0_4_ = fVar312;
    auVar80._8_4_ = fVar323;
    auVar80._12_4_ = fVar328;
    auVar80._16_4_ = fVar333;
    auVar80._20_4_ = fVar337;
    auVar80._24_4_ = fVar341;
    auVar80._28_4_ = fVar344;
    auVar245 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar80);
    auVar297 = ZEXT3264(auVar245);
    fVar293 = auVar245._0_4_;
    fVar300 = auVar245._4_4_;
    fVar302 = auVar245._8_4_;
    fVar304 = auVar245._12_4_;
    fVar306 = auVar245._16_4_;
    fVar308 = auVar245._20_4_;
    fVar310 = auVar245._24_4_;
    auVar348._0_4_ = fVar293 * local_660 + local_520 * fVar190 + fVar400 * local_540;
    auVar348._4_4_ = fVar300 * fStack_65c + fStack_51c * fVar234 + fVar404 * fStack_53c;
    auVar348._8_4_ = fVar302 * fStack_658 + fStack_518 * fVar251 + fVar406 * fStack_538;
    auVar348._12_4_ = fVar304 * fStack_654 + fStack_514 * fVar254 + fVar408 * fStack_534;
    auVar348._16_4_ = fVar306 * fStack_650 + fStack_510 * fVar317 + fVar410 * fStack_530;
    auVar348._20_4_ = fVar308 * fStack_64c + fStack_50c * fVar340 + fVar412 * fStack_52c;
    auVar348._24_4_ = fVar310 * fStack_648 + fStack_508 * fVar237 + fVar414 * fStack_528;
    auVar348._28_4_ = fVar123 + auVar30._28_4_ + auVar31._28_4_ + fVar123 + auVar25._28_4_;
    auVar363._0_4_ = fVar293 * fVar293 + fVar190 * fVar190 + fVar400 * fVar400;
    auVar363._4_4_ = fVar300 * fVar300 + fVar234 * fVar234 + fVar404 * fVar404;
    auVar363._8_4_ = fVar302 * fVar302 + fVar251 * fVar251 + fVar406 * fVar406;
    auVar363._12_4_ = fVar304 * fVar304 + fVar254 * fVar254 + fVar408 * fVar408;
    auVar363._16_4_ = fVar306 * fVar306 + fVar317 * fVar317 + fVar410 * fVar410;
    auVar363._20_4_ = fVar308 * fVar308 + fVar340 * fVar340 + fVar412 * fVar412;
    auVar363._24_4_ = fVar310 * fVar310 + fVar237 * fVar237 + fVar414 * fVar414;
    auVar363._28_4_ = fVar401 + fVar401 + fVar123;
    fVar211 = auVar29._0_4_;
    fVar235 = auVar29._4_4_;
    fVar253 = auVar29._8_4_;
    fVar255 = auVar29._12_4_;
    fVar322 = auVar29._16_4_;
    fVar359 = auVar29._20_4_;
    fVar238 = auVar29._24_4_;
    fVar123 = auVar26._28_4_;
    fVar370 = auVar27._28_4_;
    fVar390 = local_660 * fVar146 * fVar211 +
              local_520 * fVar144 * fVar211 + fVar292 * fVar211 * local_540;
    fVar396 = fStack_65c * fVar213 * fVar235 +
              fStack_51c * fVar212 * fVar235 + fVar299 * fVar235 * fStack_53c;
    fVar174 = fStack_658 * fVar240 * fVar253 +
              fStack_518 * fVar236 * fVar253 + fVar301 * fVar253 * fStack_538;
    fVar177 = fStack_654 * fVar250 * fVar255 +
              fStack_514 * fVar239 * fVar255 + fVar303 * fVar255 * fStack_534;
    fVar180 = fStack_650 * fVar257 * fVar322 +
              fStack_510 * fVar256 * fVar322 + fVar305 * fVar322 * fStack_530;
    fVar183 = fStack_64c * fVar332 * fVar359 +
              fStack_50c * fVar327 * fVar359 + fVar307 * fVar359 * fStack_52c;
    fVar186 = fStack_648 * fVar365 * fVar238 +
              fStack_508 * fVar360 * fVar238 + fVar309 * fVar238 * fStack_528;
    fVar189 = fVar370 + fVar123 + 0.0;
    fVar372 = fVar370 + fVar123 + 0.0;
    local_440 = fVar293 * fVar146 * fVar211 +
                fVar144 * fVar211 * fVar190 + fVar400 * fVar292 * fVar211;
    fStack_43c = fVar300 * fVar213 * fVar235 +
                 fVar212 * fVar235 * fVar234 + fVar404 * fVar299 * fVar235;
    fStack_438 = fVar302 * fVar240 * fVar253 +
                 fVar236 * fVar253 * fVar251 + fVar406 * fVar301 * fVar253;
    fStack_434 = fVar304 * fVar250 * fVar255 +
                 fVar239 * fVar255 * fVar254 + fVar408 * fVar303 * fVar255;
    fStack_430 = fVar306 * fVar257 * fVar322 +
                 fVar256 * fVar322 * fVar317 + fVar410 * fVar305 * fVar322;
    fStack_42c = fVar308 * fVar332 * fVar359 +
                 fVar327 * fVar359 * fVar340 + fVar412 * fVar307 * fVar359;
    fStack_428 = fVar310 * fVar365 * fVar238 +
                 fVar360 * fVar238 * fVar237 + fVar414 * fVar309 * fVar238;
    fStack_424 = fVar123 + fVar372;
    auVar26._4_4_ = fStack_43c * fVar396;
    auVar26._0_4_ = local_440 * fVar390;
    auVar26._8_4_ = fStack_438 * fVar174;
    auVar26._12_4_ = fStack_434 * fVar177;
    auVar26._16_4_ = fStack_430 * fVar180;
    auVar26._20_4_ = fStack_42c * fVar183;
    auVar26._24_4_ = fStack_428 * fVar186;
    auVar26._28_4_ = fVar372;
    auVar26 = vsubps_avx(auVar348,auVar26);
    auVar45._4_4_ = fStack_43c * fStack_43c;
    auVar45._0_4_ = local_440 * local_440;
    auVar45._8_4_ = fStack_438 * fStack_438;
    auVar45._12_4_ = fStack_434 * fStack_434;
    auVar45._16_4_ = fStack_430 * fStack_430;
    auVar45._20_4_ = fStack_42c * fStack_42c;
    auVar45._24_4_ = fStack_428 * fStack_428;
    auVar45._28_4_ = fVar123;
    auVar27 = vsubps_avx(auVar363,auVar45);
    auVar25 = vsqrtps_avx(auVar113);
    fVar123 = (auVar114._0_4_ + auVar25._0_4_) * 1.0000002;
    fVar372 = (auVar114._4_4_ + auVar25._4_4_) * 1.0000002;
    fVar374 = (auVar114._8_4_ + auVar25._8_4_) * 1.0000002;
    fVar376 = (auVar114._12_4_ + auVar25._12_4_) * 1.0000002;
    fVar378 = (auVar114._16_4_ + auVar25._16_4_) * 1.0000002;
    fVar384 = (auVar114._20_4_ + auVar25._20_4_) * 1.0000002;
    fVar386 = (auVar114._24_4_ + auVar25._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar372 * fVar372;
    auVar46._0_4_ = fVar123 * fVar123;
    auVar46._8_4_ = fVar374 * fVar374;
    auVar46._12_4_ = fVar376 * fVar376;
    auVar46._16_4_ = fVar378 * fVar378;
    auVar46._20_4_ = fVar384 * fVar384;
    auVar46._24_4_ = fVar386 * fVar386;
    auVar46._28_4_ = auVar114._28_4_ + auVar25._28_4_;
    fVar372 = auVar26._0_4_ + auVar26._0_4_;
    fVar374 = auVar26._4_4_ + auVar26._4_4_;
    local_300._0_8_ = CONCAT44(fVar374,fVar372);
    local_300._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_300._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_300._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_300._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_300._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    local_300._28_4_ = auVar26._28_4_ + auVar26._28_4_;
    auVar26 = vsubps_avx(auVar27,auVar46);
    auVar47._4_4_ = fVar396 * fVar396;
    auVar47._0_4_ = fVar390 * fVar390;
    auVar47._8_4_ = fVar174 * fVar174;
    auVar47._12_4_ = fVar177 * fVar177;
    auVar47._16_4_ = fVar180 * fVar180;
    auVar47._20_4_ = fVar183 * fVar183;
    auVar47._24_4_ = fVar186 * fVar186;
    auVar47._28_4_ = auVar114._28_4_;
    auVar114 = vsubps_avx(local_280,auVar47);
    auVar48._4_4_ = fVar374 * fVar374;
    auVar48._0_4_ = fVar372 * fVar372;
    auVar48._8_4_ = local_300._8_4_ * local_300._8_4_;
    auVar48._12_4_ = local_300._12_4_ * local_300._12_4_;
    auVar48._16_4_ = local_300._16_4_ * local_300._16_4_;
    auVar48._20_4_ = local_300._20_4_ * local_300._20_4_;
    auVar48._24_4_ = local_300._24_4_ * local_300._24_4_;
    auVar48._28_4_ = fVar189;
    fVar376 = auVar114._0_4_;
    fVar378 = auVar114._4_4_;
    fVar384 = auVar114._8_4_;
    fVar386 = auVar114._12_4_;
    fVar392 = auVar114._16_4_;
    fVar395 = auVar114._20_4_;
    fVar398 = auVar114._24_4_;
    auVar49._4_4_ = auVar26._4_4_ * fVar378 * 4.0;
    auVar49._0_4_ = auVar26._0_4_ * fVar376 * 4.0;
    auVar49._8_4_ = auVar26._8_4_ * fVar384 * 4.0;
    auVar49._12_4_ = auVar26._12_4_ * fVar386 * 4.0;
    auVar49._16_4_ = auVar26._16_4_ * fVar392 * 4.0;
    auVar49._20_4_ = auVar26._20_4_ * fVar395 * 4.0;
    auVar49._24_4_ = auVar26._24_4_ * fVar398 * 4.0;
    auVar49._28_4_ = 0x40800000;
    auVar29 = vsubps_avx(auVar48,auVar49);
    auVar113 = vcmpps_avx(auVar29,ZEXT432(0) << 0x20,5);
    fVar123 = auVar114._28_4_;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0x7f,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar113 >> 0xbf,0) == '\0') &&
        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar113[0x1f])
    {
      auVar381._8_4_ = 0x7f800000;
      auVar381._0_8_ = 0x7f8000007f800000;
      auVar381._12_4_ = 0x7f800000;
      auVar381._16_4_ = 0x7f800000;
      auVar381._20_4_ = 0x7f800000;
      auVar381._24_4_ = 0x7f800000;
      auVar381._28_4_ = 0x7f800000;
      auVar355._8_4_ = 0xff800000;
      auVar355._0_8_ = 0xff800000ff800000;
      auVar355._12_4_ = 0xff800000;
      auVar355._16_4_ = 0xff800000;
      auVar355._20_4_ = 0xff800000;
      auVar355._24_4_ = 0xff800000;
      auVar355._28_4_ = 0xff800000;
    }
    else {
      auVar245 = vcmpps_avx(auVar29,ZEXT432(0) << 0x20,5);
      auVar30 = vsqrtps_avx(auVar29);
      auVar263._0_4_ = fVar376 + fVar376;
      auVar263._4_4_ = fVar378 + fVar378;
      auVar263._8_4_ = fVar384 + fVar384;
      auVar263._12_4_ = fVar386 + fVar386;
      auVar263._16_4_ = fVar392 + fVar392;
      auVar263._20_4_ = fVar395 + fVar395;
      auVar263._24_4_ = fVar398 + fVar398;
      auVar263._28_4_ = fVar123 + fVar123;
      auVar29 = vrcpps_avx(auVar263);
      fVar258 = auVar29._0_4_;
      fVar269 = auVar29._4_4_;
      auVar50._4_4_ = auVar263._4_4_ * fVar269;
      auVar50._0_4_ = auVar263._0_4_ * fVar258;
      fVar270 = auVar29._8_4_;
      auVar50._8_4_ = auVar263._8_4_ * fVar270;
      fVar271 = auVar29._12_4_;
      auVar50._12_4_ = auVar263._12_4_ * fVar271;
      fVar272 = auVar29._16_4_;
      auVar50._16_4_ = auVar263._16_4_ * fVar272;
      fVar273 = auVar29._20_4_;
      auVar50._20_4_ = auVar263._20_4_ * fVar273;
      fVar274 = auVar29._24_4_;
      auVar50._24_4_ = auVar263._24_4_ * fVar274;
      auVar50._28_4_ = auVar263._28_4_;
      auVar349._8_4_ = 0x3f800000;
      auVar349._0_8_ = 0x3f8000003f800000;
      auVar349._12_4_ = 0x3f800000;
      auVar349._16_4_ = 0x3f800000;
      auVar349._20_4_ = 0x3f800000;
      auVar349._24_4_ = 0x3f800000;
      auVar349._28_4_ = 0x3f800000;
      auVar31 = vsubps_avx(auVar349,auVar50);
      fVar258 = fVar258 + fVar258 * auVar31._0_4_;
      fVar269 = fVar269 + fVar269 * auVar31._4_4_;
      fVar270 = fVar270 + fVar270 * auVar31._8_4_;
      fVar271 = fVar271 + fVar271 * auVar31._12_4_;
      fVar272 = fVar272 + fVar272 * auVar31._16_4_;
      fVar273 = fVar273 + fVar273 * auVar31._20_4_;
      fVar274 = fVar274 + fVar274 * auVar31._24_4_;
      auVar282._0_8_ = CONCAT44(fVar374,fVar372) ^ 0x8000000080000000;
      auVar282._8_4_ = -local_300._8_4_;
      auVar282._12_4_ = -local_300._12_4_;
      auVar282._16_4_ = -local_300._16_4_;
      auVar282._20_4_ = -local_300._20_4_;
      auVar282._24_4_ = -local_300._24_4_;
      auVar282._28_4_ = -local_300._28_4_;
      auVar32 = vsubps_avx(auVar282,auVar30);
      fVar372 = auVar32._0_4_ * fVar258;
      fVar374 = auVar32._4_4_ * fVar269;
      auVar51._4_4_ = fVar374;
      auVar51._0_4_ = fVar372;
      fVar288 = auVar32._8_4_ * fVar270;
      auVar51._8_4_ = fVar288;
      fVar289 = auVar32._12_4_ * fVar271;
      auVar51._12_4_ = fVar289;
      fVar290 = auVar32._16_4_ * fVar272;
      auVar51._16_4_ = fVar290;
      fVar291 = auVar32._20_4_ * fVar273;
      auVar51._20_4_ = fVar291;
      fVar214 = auVar32._24_4_ * fVar274;
      auVar51._24_4_ = fVar214;
      auVar51._28_4_ = auVar32._28_4_;
      auVar30 = vsubps_avx(auVar30,local_300);
      fVar258 = auVar30._0_4_ * fVar258;
      fVar269 = auVar30._4_4_ * fVar269;
      auVar52._4_4_ = fVar269;
      auVar52._0_4_ = fVar258;
      fVar270 = auVar30._8_4_ * fVar270;
      auVar52._8_4_ = fVar270;
      fVar271 = auVar30._12_4_ * fVar271;
      auVar52._12_4_ = fVar271;
      fVar272 = auVar30._16_4_ * fVar272;
      auVar52._16_4_ = fVar272;
      fVar273 = auVar30._20_4_ * fVar273;
      auVar52._20_4_ = fVar273;
      fVar274 = auVar30._24_4_ * fVar274;
      auVar52._24_4_ = fVar274;
      auVar52._28_4_ = auVar30._28_4_;
      fStack_624 = fStack_424 + auVar29._28_4_ + auVar31._28_4_;
      local_640 = fVar211 * (local_440 + fVar390 * fVar372);
      fStack_63c = fVar235 * (fStack_43c + fVar396 * fVar374);
      fStack_638 = fVar253 * (fStack_438 + fVar174 * fVar288);
      fStack_634 = fVar255 * (fStack_434 + fVar177 * fVar289);
      fStack_630 = fVar322 * (fStack_430 + fVar180 * fVar290);
      fStack_62c = fVar359 * (fStack_42c + fVar183 * fVar291);
      fStack_628 = fVar238 * (fStack_428 + fVar186 * fVar214);
      auVar350._8_4_ = 0x7fffffff;
      auVar350._0_8_ = 0x7fffffff7fffffff;
      auVar350._12_4_ = 0x7fffffff;
      auVar350._16_4_ = 0x7fffffff;
      auVar350._20_4_ = 0x7fffffff;
      auVar350._24_4_ = 0x7fffffff;
      auVar350._28_4_ = 0x7fffffff;
      auVar29 = vandps_avx(auVar47,auVar350);
      auVar29 = vmaxps_avx(local_420,auVar29);
      auVar53._4_4_ = auVar29._4_4_ * 1.9073486e-06;
      auVar53._0_4_ = auVar29._0_4_ * 1.9073486e-06;
      auVar53._8_4_ = auVar29._8_4_ * 1.9073486e-06;
      auVar53._12_4_ = auVar29._12_4_ * 1.9073486e-06;
      auVar53._16_4_ = auVar29._16_4_ * 1.9073486e-06;
      auVar53._20_4_ = auVar29._20_4_ * 1.9073486e-06;
      auVar53._24_4_ = auVar29._24_4_ * 1.9073486e-06;
      auVar53._28_4_ = auVar29._28_4_;
      auVar29 = vandps_avx(auVar114,auVar350);
      auVar29 = vcmpps_avx(auVar29,auVar53,1);
      auVar356._8_4_ = 0x7f800000;
      auVar356._0_8_ = 0x7f8000007f800000;
      auVar356._12_4_ = 0x7f800000;
      auVar356._16_4_ = 0x7f800000;
      auVar356._20_4_ = 0x7f800000;
      auVar356._24_4_ = 0x7f800000;
      auVar356._28_4_ = 0x7f800000;
      auVar381 = vblendvps_avx(auVar356,auVar51,auVar245);
      local_2e0 = fVar211 * (local_440 + fVar390 * fVar258);
      fStack_2dc = fVar235 * (fStack_43c + fVar396 * fVar269);
      fStack_2d8 = fVar253 * (fStack_438 + fVar174 * fVar270);
      fStack_2d4 = fVar255 * (fStack_434 + fVar177 * fVar271);
      fStack_2d0 = fVar322 * (fStack_430 + fVar180 * fVar272);
      fStack_2cc = fVar359 * (fStack_42c + fVar183 * fVar273);
      fStack_2c8 = fVar238 * (fStack_428 + fVar186 * fVar274);
      fStack_2c4 = fVar189;
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
      auVar355 = vblendvps_avx(auVar264,auVar52,auVar245);
      auVar30 = auVar245 & auVar29;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar113 = vandps_avx(auVar29,auVar245);
        auVar223 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar29 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
        auVar170._8_4_ = 0xff800000;
        auVar170._0_8_ = 0xff800000ff800000;
        auVar170._12_4_ = 0xff800000;
        auVar170._16_4_ = 0xff800000;
        auVar170._20_4_ = 0xff800000;
        auVar170._24_4_ = 0xff800000;
        auVar170._28_4_ = 0xff800000;
        auVar364._8_4_ = 0x7f800000;
        auVar364._0_8_ = 0x7f8000007f800000;
        auVar364._12_4_ = 0x7f800000;
        auVar364._16_4_ = 0x7f800000;
        auVar364._20_4_ = 0x7f800000;
        auVar364._24_4_ = 0x7f800000;
        auVar364._28_4_ = 0x7f800000;
        auVar26 = vblendvps_avx(auVar364,auVar170,auVar29);
        auVar200 = vpmovsxwd_avx(auVar223);
        auVar223 = vpunpckhwd_avx(auVar223,auVar223);
        auVar248._16_16_ = auVar223;
        auVar248._0_16_ = auVar200;
        auVar381 = vblendvps_avx(auVar381,auVar26,auVar248);
        auVar26 = vblendvps_avx(auVar170,auVar364,auVar29);
        auVar355 = vblendvps_avx(auVar355,auVar26,auVar248);
        auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar143._0_4_ = auVar113._0_4_ ^ auVar26._0_4_;
        auVar143._4_4_ = auVar113._4_4_ ^ auVar26._4_4_;
        auVar143._8_4_ = auVar113._8_4_ ^ auVar26._8_4_;
        auVar143._12_4_ = auVar113._12_4_ ^ auVar26._12_4_;
        auVar143._16_4_ = auVar113._16_4_ ^ auVar26._16_4_;
        auVar143._20_4_ = auVar113._20_4_ ^ auVar26._20_4_;
        auVar143._24_4_ = auVar113._24_4_ ^ auVar26._24_4_;
        auVar143._28_4_ = auVar113._28_4_ ^ auVar26._28_4_;
        auVar113 = vorps_avx(auVar29,auVar143);
        auVar113 = vandps_avx(auVar245,auVar113);
      }
    }
    auVar358 = ZEXT3264(auVar355);
    auVar26 = local_2c0 & auVar113;
    fVar372 = (float)local_9e0._0_4_;
    fVar374 = (float)local_9e0._4_4_;
    fVar189 = fStack_9d8;
    fVar258 = fStack_9d4;
    fVar269 = fStack_9d0;
    fVar270 = fStack_9cc;
    fVar271 = fStack_9c8;
    fVar272 = fStack_9c4;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar223 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_7a0._0_4_));
      auVar223 = vshufps_avx(auVar223,auVar223,0);
      auVar246._16_16_ = auVar223;
      auVar246._0_16_ = auVar223;
      auVar245 = vmaxps_avx(auVar246,auVar381);
      auVar223 = ZEXT416((uint)(ray->tfar - (float)local_7a0._0_4_));
      auVar223 = vshufps_avx(auVar223,auVar223,0);
      auVar247._16_16_ = auVar223;
      auVar247._0_16_ = auVar223;
      auVar30 = vminps_avx(auVar247,auVar355);
      fVar214 = local_300._28_4_ + local_840._28_4_;
      auVar162._0_4_ = local_660 * fVar361 + local_520 * fVar388 + local_540 * fVar314;
      auVar162._4_4_ = fStack_65c * fVar366 + fStack_51c * fVar393 + fStack_53c * fVar320;
      auVar162._8_4_ = fStack_658 * fVar368 + fStack_518 * fVar173 + fStack_538 * fVar325;
      auVar162._12_4_ = fStack_654 * fVar371 + fStack_514 * fVar176 + fStack_534 * fVar330;
      auVar162._16_4_ = fStack_650 * fVar373 + fStack_510 * fVar179 + fStack_530 * fVar334;
      auVar162._20_4_ = fStack_64c * fVar375 + fStack_50c * fVar182 + fStack_52c * fVar338;
      auVar162._24_4_ = fStack_648 * fVar377 + fStack_508 * fVar185 + fStack_528 * fVar342;
      auVar162._28_4_ = fVar214 + fVar188 + fVar214;
      auVar26 = vrcpps_avx(auVar162);
      fVar188 = auVar26._0_4_;
      fVar273 = auVar26._4_4_;
      auVar54._4_4_ = auVar162._4_4_ * fVar273;
      auVar54._0_4_ = auVar162._0_4_ * fVar188;
      fVar274 = auVar26._8_4_;
      auVar54._8_4_ = auVar162._8_4_ * fVar274;
      fVar288 = auVar26._12_4_;
      auVar54._12_4_ = auVar162._12_4_ * fVar288;
      fVar289 = auVar26._16_4_;
      auVar54._16_4_ = auVar162._16_4_ * fVar289;
      fVar290 = auVar26._20_4_;
      auVar54._20_4_ = auVar162._20_4_ * fVar290;
      fVar291 = auVar26._24_4_;
      auVar54._24_4_ = auVar162._24_4_ * fVar291;
      auVar54._28_4_ = uStack_224;
      auVar399._8_4_ = 0x3f800000;
      auVar399._0_8_ = 0x3f8000003f800000;
      auVar399._12_4_ = 0x3f800000;
      auVar399._16_4_ = 0x3f800000;
      auVar399._20_4_ = 0x3f800000;
      auVar399._24_4_ = 0x3f800000;
      auVar399._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar399,auVar54);
      auVar283._8_4_ = 0x7fffffff;
      auVar283._0_8_ = 0x7fffffff7fffffff;
      auVar283._12_4_ = 0x7fffffff;
      auVar283._16_4_ = 0x7fffffff;
      auVar283._20_4_ = 0x7fffffff;
      auVar283._24_4_ = 0x7fffffff;
      auVar283._28_4_ = 0x7fffffff;
      auVar26 = vandps_avx(auVar162,auVar283);
      auVar382._8_4_ = 0x219392ef;
      auVar382._0_8_ = 0x219392ef219392ef;
      auVar382._12_4_ = 0x219392ef;
      auVar382._16_4_ = 0x219392ef;
      auVar382._20_4_ = 0x219392ef;
      auVar382._24_4_ = 0x219392ef;
      auVar382._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar382,1);
      auVar55._4_4_ =
           (fVar273 + fVar273 * auVar29._4_4_) *
           -(fVar300 * fVar366 + fVar393 * fVar234 + fVar320 * fVar404);
      auVar55._0_4_ =
           (fVar188 + fVar188 * auVar29._0_4_) *
           -(fVar293 * fVar361 + fVar388 * fVar190 + fVar314 * fVar400);
      auVar55._8_4_ =
           (fVar274 + fVar274 * auVar29._8_4_) *
           -(fVar302 * fVar368 + fVar173 * fVar251 + fVar325 * fVar406);
      auVar55._12_4_ =
           (fVar288 + fVar288 * auVar29._12_4_) *
           -(fVar304 * fVar371 + fVar176 * fVar254 + fVar330 * fVar408);
      auVar55._16_4_ =
           (fVar289 + fVar289 * auVar29._16_4_) *
           -(fVar306 * fVar373 + fVar179 * fVar317 + fVar334 * fVar410);
      auVar55._20_4_ =
           (fVar290 + fVar290 * auVar29._20_4_) *
           -(fVar308 * fVar375 + fVar182 * fVar340 + fVar338 * fVar412);
      auVar55._24_4_ =
           (fVar291 + fVar291 * auVar29._24_4_) *
           -(fVar310 * fVar377 + fVar185 * fVar237 + fVar342 * fVar414);
      auVar55._28_4_ = -(auVar245._28_4_ + fVar214);
      auVar29 = vcmpps_avx(auVar162,ZEXT832(0) << 0x20,1);
      auVar31 = vorps_avx(auVar26,auVar29);
      auVar29 = vcmpps_avx(auVar162,ZEXT832(0) << 0x20,6);
      auVar29 = vorps_avx(auVar26,auVar29);
      auVar357._8_4_ = 0xff800000;
      auVar357._0_8_ = 0xff800000ff800000;
      auVar357._12_4_ = 0xff800000;
      auVar357._16_4_ = 0xff800000;
      auVar357._20_4_ = 0xff800000;
      auVar357._24_4_ = 0xff800000;
      auVar357._28_4_ = 0xff800000;
      auVar358 = ZEXT3264(auVar357);
      auVar26 = vblendvps_avx(auVar55,auVar357,auVar31);
      auVar402._8_4_ = 0x7f800000;
      auVar402._0_8_ = 0x7f8000007f800000;
      auVar402._12_4_ = 0x7f800000;
      auVar402._16_4_ = 0x7f800000;
      auVar402._20_4_ = 0x7f800000;
      auVar402._24_4_ = 0x7f800000;
      auVar402._28_4_ = 0x7f800000;
      auVar29 = vblendvps_avx(auVar55,auVar402,auVar29);
      auVar26 = vmaxps_avx(auVar245,auVar26);
      auVar29 = vminps_avx(auVar30,auVar29);
      auVar245 = ZEXT832(0) << 0x20;
      auVar22 = vsubps_avx(auVar245,auVar22);
      auVar23 = vsubps_avx(auVar245,auVar23);
      auVar56._4_4_ = auVar23._4_4_ * -fVar385;
      auVar56._0_4_ = auVar23._0_4_ * -fVar379;
      auVar56._8_4_ = auVar23._8_4_ * -fVar387;
      auVar56._12_4_ = auVar23._12_4_ * -fVar389;
      auVar56._16_4_ = auVar23._16_4_ * -fVar391;
      auVar56._20_4_ = auVar23._20_4_ * -fVar394;
      auVar56._24_4_ = auVar23._24_4_ * -fVar397;
      auVar56._28_4_ = auVar23._28_4_;
      auVar57._4_4_ = fVar215 * auVar22._4_4_;
      auVar57._0_4_ = fVar149 * auVar22._0_4_;
      auVar57._8_4_ = fVar249 * auVar22._8_4_;
      auVar57._12_4_ = fVar252 * auVar22._12_4_;
      auVar57._16_4_ = fVar311 * auVar22._16_4_;
      auVar57._20_4_ = fVar336 * auVar22._20_4_;
      auVar57._24_4_ = fVar367 * auVar22._24_4_;
      auVar57._28_4_ = auVar22._28_4_;
      auVar22 = vsubps_avx(auVar56,auVar57);
      auVar23 = vsubps_avx(auVar245,local_9a0);
      auVar297 = ZEXT3264(local_820);
      auVar58._4_4_ = fVar321 * auVar23._4_4_;
      auVar58._0_4_ = fVar315 * auVar23._0_4_;
      auVar58._8_4_ = fVar326 * auVar23._8_4_;
      auVar58._12_4_ = fVar331 * auVar23._12_4_;
      auVar58._16_4_ = fVar335 * auVar23._16_4_;
      auVar58._20_4_ = fVar339 * auVar23._20_4_;
      uVar7 = auVar23._28_4_;
      auVar58._24_4_ = fVar343 * auVar23._24_4_;
      auVar58._28_4_ = uVar7;
      auVar245 = vsubps_avx(auVar22,auVar58);
      auVar59._4_4_ = fStack_53c * -fVar385;
      auVar59._0_4_ = local_540 * -fVar379;
      auVar59._8_4_ = fStack_538 * -fVar387;
      auVar59._12_4_ = fStack_534 * -fVar389;
      auVar59._16_4_ = fStack_530 * -fVar391;
      auVar59._20_4_ = fStack_52c * -fVar394;
      auVar59._24_4_ = fStack_528 * -fVar397;
      auVar59._28_4_ = -fVar401;
      auVar60._4_4_ = fStack_51c * fVar215;
      auVar60._0_4_ = local_520 * fVar149;
      auVar60._8_4_ = fStack_518 * fVar249;
      auVar60._12_4_ = fStack_514 * fVar252;
      auVar60._16_4_ = fStack_510 * fVar311;
      auVar60._20_4_ = fStack_50c * fVar336;
      auVar60._24_4_ = fStack_508 * fVar367;
      auVar60._28_4_ = uVar7;
      auVar22 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar321 * fStack_65c;
      auVar61._0_4_ = fVar315 * local_660;
      auVar61._8_4_ = fVar326 * fStack_658;
      auVar61._12_4_ = fVar331 * fStack_654;
      auVar61._16_4_ = fVar335 * fStack_650;
      auVar61._20_4_ = fVar339 * fStack_64c;
      auVar61._24_4_ = fVar343 * fStack_648;
      auVar61._28_4_ = uVar7;
      auVar30 = vsubps_avx(auVar22,auVar61);
      auVar22 = vrcpps_avx(auVar30);
      fVar149 = auVar22._0_4_;
      fVar190 = auVar22._4_4_;
      auVar62._4_4_ = auVar30._4_4_ * fVar190;
      auVar62._0_4_ = auVar30._0_4_ * fVar149;
      fVar215 = auVar22._8_4_;
      auVar62._8_4_ = auVar30._8_4_ * fVar215;
      fVar234 = auVar22._12_4_;
      auVar62._12_4_ = auVar30._12_4_ * fVar234;
      fVar249 = auVar22._16_4_;
      auVar62._16_4_ = auVar30._16_4_ * fVar249;
      fVar251 = auVar22._20_4_;
      auVar62._20_4_ = auVar30._20_4_ * fVar251;
      fVar252 = auVar22._24_4_;
      auVar62._24_4_ = auVar30._24_4_ * fVar252;
      auVar62._28_4_ = fStack_504;
      auVar31 = vsubps_avx(auVar399,auVar62);
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116._16_4_ = 0x7fffffff;
      auVar116._20_4_ = 0x7fffffff;
      auVar116._24_4_ = 0x7fffffff;
      auVar116._28_4_ = 0x7fffffff;
      auVar22 = vandps_avx(auVar30,auVar116);
      auVar23 = vcmpps_avx(auVar22,auVar382,1);
      auVar63._4_4_ = (fVar190 + fVar190 * auVar31._4_4_) * -auVar245._4_4_;
      auVar63._0_4_ = (fVar149 + fVar149 * auVar31._0_4_) * -auVar245._0_4_;
      auVar63._8_4_ = (fVar215 + fVar215 * auVar31._8_4_) * -auVar245._8_4_;
      auVar63._12_4_ = (fVar234 + fVar234 * auVar31._12_4_) * -auVar245._12_4_;
      auVar63._16_4_ = (fVar249 + fVar249 * auVar31._16_4_) * -auVar245._16_4_;
      auVar63._20_4_ = (fVar251 + fVar251 * auVar31._20_4_) * -auVar245._20_4_;
      auVar63._24_4_ = (fVar252 + fVar252 * auVar31._24_4_) * -auVar245._24_4_;
      auVar63._28_4_ = auVar245._28_4_ ^ 0x80000000;
      auVar22 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,1);
      auVar22 = vorps_avx(auVar23,auVar22);
      auVar22 = vblendvps_avx(auVar63,auVar357,auVar22);
      _local_740 = vmaxps_avx(auVar26,auVar22);
      auVar22 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,6);
      auVar22 = vorps_avx(auVar23,auVar22);
      auVar22 = vblendvps_avx(auVar63,auVar402,auVar22);
      auVar113 = vandps_avx(local_2c0,auVar113);
      local_4a0 = vminps_avx(auVar29,auVar22);
      auVar22 = vcmpps_avx(_local_740,local_4a0,2);
      auVar23 = auVar113 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar23 = vminps_avx(local_6e0,auVar115);
        auVar24 = vminps_avx(auVar24,auVar28);
        auVar23 = vminps_avx(auVar23,auVar24);
        auVar23 = vsubps_avx(auVar23,auVar25);
        auVar113 = vandps_avx(auVar22,auVar113);
        auVar85._4_4_ = fStack_63c;
        auVar85._0_4_ = local_640;
        auVar85._8_4_ = fStack_638;
        auVar85._12_4_ = fStack_634;
        auVar85._16_4_ = fStack_630;
        auVar85._20_4_ = fStack_62c;
        auVar85._24_4_ = fStack_628;
        auVar85._28_4_ = fStack_624;
        auVar25 = vminps_avx(auVar85,auVar399);
        auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar405 + fVar413 * (auVar25._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar407 + fVar415 * (auVar25._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar409 + fVar145 * (auVar25._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar411 + fVar148 * (auVar25._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar405 + fVar413 * (auVar25._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar407 + fVar415 * (auVar25._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar409 + fVar145 * (auVar25._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar411 + auVar25._28_4_ + 7.0;
        auVar86._4_4_ = fStack_2dc;
        auVar86._0_4_ = local_2e0;
        auVar86._8_4_ = fStack_2d8;
        auVar86._12_4_ = fStack_2d4;
        auVar86._16_4_ = fStack_2d0;
        auVar86._20_4_ = fStack_2cc;
        auVar86._24_4_ = fStack_2c8;
        auVar86._28_4_ = fStack_2c4;
        auVar25 = vminps_avx(auVar86,auVar399);
        auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar405 + fVar413 * (auVar25._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar407 + fVar415 * (auVar25._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar409 + fVar145 * (auVar25._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar411 + fVar148 * (auVar25._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar405 + fVar413 * (auVar25._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar407 + fVar415 * (auVar25._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar409 + fVar145 * (auVar25._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar411 + auVar25._28_4_ + 7.0;
        auVar64._4_4_ = auVar23._4_4_ * 0.99999976;
        auVar64._0_4_ = auVar23._0_4_ * 0.99999976;
        auVar64._8_4_ = auVar23._8_4_ * 0.99999976;
        auVar64._12_4_ = auVar23._12_4_ * 0.99999976;
        auVar64._16_4_ = auVar23._16_4_ * 0.99999976;
        auVar64._20_4_ = auVar23._20_4_ * 0.99999976;
        auVar64._24_4_ = auVar23._24_4_ * 0.99999976;
        auVar64._28_4_ = 0x3f7ffffc;
        auVar25 = vmaxps_avx(ZEXT832(0) << 0x20,auVar64);
        auVar65._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar65._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar65._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar65._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar65._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar65._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar65._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar65._28_4_ = auVar25._28_4_;
        auVar22 = vsubps_avx(auVar27,auVar65);
        auVar66._4_4_ = auVar22._4_4_ * fVar378 * 4.0;
        auVar66._0_4_ = auVar22._0_4_ * fVar376 * 4.0;
        auVar66._8_4_ = auVar22._8_4_ * fVar384 * 4.0;
        auVar66._12_4_ = auVar22._12_4_ * fVar386 * 4.0;
        auVar66._16_4_ = auVar22._16_4_ * fVar392 * 4.0;
        auVar66._20_4_ = auVar22._20_4_ * fVar395 * 4.0;
        auVar66._24_4_ = auVar22._24_4_ * fVar398 * 4.0;
        auVar66._28_4_ = auVar25._28_4_;
        auVar23 = vsubps_avx(auVar48,auVar66);
        local_980 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,5);
        auVar25 = local_980;
        if ((((((((local_980 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_980 >> 0x7f,0) == '\0') &&
              (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_980 >> 0xbf,0) == '\0') &&
            (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_980[0x1f]) {
          _local_780 = ZEXT832(0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          auVar205 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar228 = ZEXT828(0) << 0x20;
          auVar265._8_4_ = 0x7f800000;
          auVar265._0_8_ = 0x7f8000007f800000;
          auVar265._12_4_ = 0x7f800000;
          auVar265._16_4_ = 0x7f800000;
          auVar265._20_4_ = 0x7f800000;
          auVar265._24_4_ = 0x7f800000;
          auVar265._28_4_ = 0x7f800000;
          auVar284._8_4_ = 0xff800000;
          auVar284._0_8_ = 0xff800000ff800000;
          auVar284._12_4_ = 0xff800000;
          auVar284._16_4_ = 0xff800000;
          auVar284._20_4_ = 0xff800000;
          auVar284._24_4_ = 0xff800000;
          auVar284._28_4_ = 0xff800000;
          local_980 = auVar33;
          _local_760 = _local_780;
          _local_680 = _local_8e0;
        }
        else {
          auVar28 = vsqrtps_avx(auVar23);
          auVar208._0_4_ = fVar376 + fVar376;
          auVar208._4_4_ = fVar378 + fVar378;
          auVar208._8_4_ = fVar384 + fVar384;
          auVar208._12_4_ = fVar386 + fVar386;
          auVar208._16_4_ = fVar392 + fVar392;
          auVar208._20_4_ = fVar395 + fVar395;
          auVar208._24_4_ = fVar398 + fVar398;
          auVar208._28_4_ = fVar123 + fVar123;
          auVar24 = vrcpps_avx(auVar208);
          fVar123 = auVar24._0_4_;
          fVar149 = auVar24._4_4_;
          auVar67._4_4_ = auVar208._4_4_ * fVar149;
          auVar67._0_4_ = auVar208._0_4_ * fVar123;
          fVar190 = auVar24._8_4_;
          auVar67._8_4_ = auVar208._8_4_ * fVar190;
          fVar215 = auVar24._12_4_;
          auVar67._12_4_ = auVar208._12_4_ * fVar215;
          fVar234 = auVar24._16_4_;
          auVar67._16_4_ = auVar208._16_4_ * fVar234;
          fVar249 = auVar24._20_4_;
          auVar67._20_4_ = auVar208._20_4_ * fVar249;
          fVar251 = auVar24._24_4_;
          auVar67._24_4_ = auVar208._24_4_ * fVar251;
          auVar67._28_4_ = auVar208._28_4_;
          auVar26 = vsubps_avx(auVar399,auVar67);
          fVar123 = fVar123 + fVar123 * auVar26._0_4_;
          fVar149 = fVar149 + fVar149 * auVar26._4_4_;
          fVar190 = fVar190 + fVar190 * auVar26._8_4_;
          fVar215 = fVar215 + fVar215 * auVar26._12_4_;
          fVar234 = fVar234 + fVar234 * auVar26._16_4_;
          fVar249 = fVar249 + fVar249 * auVar26._20_4_;
          fVar251 = fVar251 + fVar251 * auVar26._24_4_;
          fVar252 = auVar24._28_4_ + auVar26._28_4_;
          auVar230._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar230._8_4_ = -local_300._8_4_;
          auVar230._12_4_ = -local_300._12_4_;
          auVar230._16_4_ = -local_300._16_4_;
          auVar230._20_4_ = -local_300._20_4_;
          auVar230._24_4_ = -local_300._24_4_;
          auVar230._28_4_ = -local_300._28_4_;
          auVar24 = vsubps_avx(auVar230,auVar28);
          fVar401 = auVar24._0_4_ * fVar123;
          fVar405 = auVar24._4_4_ * fVar149;
          auVar68._4_4_ = fVar405;
          auVar68._0_4_ = fVar401;
          fVar407 = auVar24._8_4_ * fVar190;
          auVar68._8_4_ = fVar407;
          fVar409 = auVar24._12_4_ * fVar215;
          auVar68._12_4_ = fVar409;
          fVar411 = auVar24._16_4_ * fVar234;
          auVar68._16_4_ = fVar411;
          fVar413 = auVar24._20_4_ * fVar249;
          auVar68._20_4_ = fVar413;
          fVar415 = auVar24._24_4_ * fVar251;
          auVar68._24_4_ = fVar415;
          auVar68._28_4_ = 0x7f800000;
          auVar28 = vsubps_avx(auVar28,local_300);
          fVar123 = auVar28._0_4_ * fVar123;
          fVar149 = auVar28._4_4_ * fVar149;
          auVar69._4_4_ = fVar149;
          auVar69._0_4_ = fVar123;
          fVar190 = auVar28._8_4_ * fVar190;
          auVar69._8_4_ = fVar190;
          fVar215 = auVar28._12_4_ * fVar215;
          auVar69._12_4_ = fVar215;
          fVar234 = auVar28._16_4_ * fVar234;
          auVar69._16_4_ = fVar234;
          fVar249 = auVar28._20_4_ * fVar249;
          auVar69._20_4_ = fVar249;
          fVar251 = auVar28._24_4_ * fVar251;
          auVar69._24_4_ = fVar251;
          auVar69._28_4_ = fVar369;
          fVar254 = fVar211 * (fVar401 * fVar390 + local_440);
          fVar311 = fVar235 * (fVar405 * fVar396 + fStack_43c);
          fVar317 = fVar253 * (fVar407 * fVar174 + fStack_438);
          fVar336 = fVar255 * (fVar409 * fVar177 + fStack_434);
          fVar340 = fVar322 * (fVar411 * fVar180 + fStack_430);
          fVar367 = fVar359 * (fVar413 * fVar183 + fStack_42c);
          fVar237 = fVar238 * (fVar415 * fVar186 + fStack_428);
          auVar136._0_4_ = fVar312 + fVar146 * fVar254;
          auVar136._4_4_ = fVar318 + fVar213 * fVar311;
          auVar136._8_4_ = fVar323 + fVar240 * fVar317;
          auVar136._12_4_ = fVar328 + fVar250 * fVar336;
          auVar136._16_4_ = fVar333 + fVar257 * fVar340;
          auVar136._20_4_ = fVar337 + fVar332 * fVar367;
          auVar136._24_4_ = fVar341 + fVar365 * fVar237;
          auVar136._28_4_ = fVar344 + auVar28._28_4_ + fStack_424;
          auVar70._4_4_ = fStack_65c * fVar405;
          auVar70._0_4_ = local_660 * fVar401;
          auVar70._8_4_ = fStack_658 * fVar407;
          auVar70._12_4_ = fStack_654 * fVar409;
          auVar70._16_4_ = fStack_650 * fVar411;
          auVar70._20_4_ = fStack_64c * fVar413;
          auVar70._24_4_ = fStack_648 * fVar415;
          auVar70._28_4_ = fVar252;
          local_7e0 = vsubps_avx(auVar70,auVar136);
          auVar209._0_4_ = fVar313 + fVar144 * fVar254;
          auVar209._4_4_ = fVar319 + fVar212 * fVar311;
          auVar209._8_4_ = fVar324 + fVar236 * fVar317;
          auVar209._12_4_ = fVar329 + fVar239 * fVar336;
          auVar209._16_4_ = fStack_7b0 + fVar256 * fVar340;
          auVar209._20_4_ = fStack_7ac + fVar327 * fVar367;
          auVar209._24_4_ = fStack_7a8 + fVar360 * fVar237;
          auVar209._28_4_ = fStack_7a4 + fVar252;
          auVar266._0_4_ = local_520 * fVar401;
          auVar266._4_4_ = fStack_51c * fVar405;
          auVar266._8_4_ = fStack_518 * fVar407;
          auVar266._12_4_ = fStack_514 * fVar409;
          auVar266._16_4_ = fStack_510 * fVar411;
          auVar266._20_4_ = fStack_50c * fVar413;
          auVar266._24_4_ = fStack_508 * fVar415;
          auVar266._28_4_ = 0;
          _local_8e0 = vsubps_avx(auVar266,auVar209);
          auVar231._0_4_ = fVar150 + fVar292 * fVar254;
          auVar231._4_4_ = fVar171 + fVar299 * fVar311;
          auVar231._8_4_ = fVar172 + fVar301 * fVar317;
          auVar231._12_4_ = fVar175 + fVar303 * fVar336;
          auVar231._16_4_ = fVar178 + fVar305 * fVar340;
          auVar231._20_4_ = fVar181 + fVar307 * fVar367;
          auVar231._24_4_ = fVar184 + fVar309 * fVar237;
          auVar231._28_4_ = fVar187 + auVar24._28_4_;
          auVar71._4_4_ = fVar405 * fStack_53c;
          auVar71._0_4_ = fVar401 * local_540;
          auVar71._8_4_ = fVar407 * fStack_538;
          auVar71._12_4_ = fVar409 * fStack_534;
          auVar71._16_4_ = fVar411 * fStack_530;
          auVar71._20_4_ = fVar413 * fStack_52c;
          auVar71._24_4_ = fVar415 * fStack_528;
          auVar71._28_4_ = 0;
          auVar24 = vsubps_avx(auVar71,auVar231);
          auVar228 = auVar24._0_28_;
          fVar211 = fVar211 * (fVar123 * fVar390 + local_440);
          fVar235 = fVar235 * (fVar149 * fVar396 + fStack_43c);
          fVar253 = fVar253 * (fVar190 * fVar174 + fStack_438);
          fVar255 = fVar255 * (fVar215 * fVar177 + fStack_434);
          fVar322 = fVar322 * (fVar234 * fVar180 + fStack_430);
          fVar359 = fVar359 * (fVar249 * fVar183 + fStack_42c);
          fVar238 = fVar238 * (fVar251 * fVar186 + fStack_428);
          auVar285._0_4_ = fVar312 + fVar146 * fVar211;
          auVar285._4_4_ = fVar318 + fVar213 * fVar235;
          auVar285._8_4_ = fVar323 + fVar240 * fVar253;
          auVar285._12_4_ = fVar328 + fVar250 * fVar255;
          auVar285._16_4_ = fVar333 + fVar257 * fVar322;
          auVar285._20_4_ = fVar337 + fVar332 * fVar359;
          auVar285._24_4_ = fVar341 + fVar365 * fVar238;
          auVar285._28_4_ = fVar344 + fVar370;
          auVar72._4_4_ = fStack_65c * fVar149;
          auVar72._0_4_ = local_660 * fVar123;
          auVar72._8_4_ = fStack_658 * fVar190;
          auVar72._12_4_ = fStack_654 * fVar215;
          auVar72._16_4_ = fStack_650 * fVar234;
          auVar72._20_4_ = fStack_64c * fVar249;
          auVar72._24_4_ = fStack_648 * fVar251;
          auVar72._28_4_ = fVar344;
          _local_760 = vsubps_avx(auVar72,auVar285);
          auVar286._0_4_ = fVar313 + fVar144 * fVar211;
          auVar286._4_4_ = fVar319 + fVar212 * fVar235;
          auVar286._8_4_ = fVar324 + fVar236 * fVar253;
          auVar286._12_4_ = fVar329 + fVar239 * fVar255;
          auVar286._16_4_ = fStack_7b0 + fVar256 * fVar322;
          auVar286._20_4_ = fStack_7ac + fVar327 * fVar359;
          auVar286._24_4_ = fStack_7a8 + fVar360 * fVar238;
          auVar286._28_4_ = fStack_7a4 + local_760._28_4_;
          auVar73._4_4_ = fStack_51c * fVar149;
          auVar73._0_4_ = local_520 * fVar123;
          auVar73._8_4_ = fStack_518 * fVar190;
          auVar73._12_4_ = fStack_514 * fVar215;
          auVar73._16_4_ = fStack_510 * fVar234;
          auVar73._20_4_ = fStack_50c * fVar249;
          auVar73._24_4_ = fStack_508 * fVar251;
          auVar73._28_4_ = fVar344;
          _local_780 = vsubps_avx(auVar73,auVar286);
          auVar267._0_4_ = fVar150 + fVar292 * fVar211;
          auVar267._4_4_ = fVar171 + fVar299 * fVar235;
          auVar267._8_4_ = fVar172 + fVar301 * fVar253;
          auVar267._12_4_ = fVar175 + fVar303 * fVar255;
          auVar267._16_4_ = fVar178 + fVar305 * fVar322;
          auVar267._20_4_ = fVar181 + fVar307 * fVar359;
          auVar267._24_4_ = fVar184 + fVar309 * fVar238;
          auVar267._28_4_ = fVar187 + fStack_424 + 0.0;
          auVar74._4_4_ = fVar149 * fStack_53c;
          auVar74._0_4_ = fVar123 * local_540;
          auVar74._8_4_ = fVar190 * fStack_538;
          auVar74._12_4_ = fVar215 * fStack_534;
          auVar74._16_4_ = fVar234 * fStack_530;
          auVar74._20_4_ = fVar249 * fStack_52c;
          auVar74._24_4_ = fVar251 * fStack_528;
          auVar74._28_4_ = local_780._28_4_;
          _local_680 = vsubps_avx(auVar74,auVar267);
          auVar24 = vcmpps_avx(auVar23,_DAT_01faff00,5);
          auVar268._8_4_ = 0x7f800000;
          auVar268._0_8_ = 0x7f8000007f800000;
          auVar268._12_4_ = 0x7f800000;
          auVar268._16_4_ = 0x7f800000;
          auVar268._20_4_ = 0x7f800000;
          auVar268._24_4_ = 0x7f800000;
          auVar268._28_4_ = 0x7f800000;
          auVar265 = vblendvps_avx(auVar268,auVar68,auVar24);
          auVar351._8_4_ = 0x7fffffff;
          auVar351._0_8_ = 0x7fffffff7fffffff;
          auVar351._12_4_ = 0x7fffffff;
          auVar351._16_4_ = 0x7fffffff;
          auVar351._20_4_ = 0x7fffffff;
          auVar351._24_4_ = 0x7fffffff;
          auVar351._28_4_ = 0x7fffffff;
          auVar23 = vandps_avx(auVar351,auVar47);
          auVar23 = vmaxps_avx(local_420,auVar23);
          auVar75._4_4_ = auVar23._4_4_ * 1.9073486e-06;
          auVar75._0_4_ = auVar23._0_4_ * 1.9073486e-06;
          auVar75._8_4_ = auVar23._8_4_ * 1.9073486e-06;
          auVar75._12_4_ = auVar23._12_4_ * 1.9073486e-06;
          auVar75._16_4_ = auVar23._16_4_ * 1.9073486e-06;
          auVar75._20_4_ = auVar23._20_4_ * 1.9073486e-06;
          auVar75._24_4_ = auVar23._24_4_ * 1.9073486e-06;
          auVar75._28_4_ = auVar23._28_4_;
          auVar114 = vandps_avx(auVar351,auVar114);
          auVar114 = vcmpps_avx(auVar114,auVar75,1);
          auVar287._8_4_ = 0xff800000;
          auVar287._0_8_ = 0xff800000ff800000;
          auVar287._12_4_ = 0xff800000;
          auVar287._16_4_ = 0xff800000;
          auVar287._20_4_ = 0xff800000;
          auVar287._24_4_ = 0xff800000;
          auVar287._28_4_ = 0xff800000;
          auVar284 = vblendvps_avx(auVar287,auVar69,auVar24);
          auVar23 = auVar24 & auVar114;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            auVar114 = vandps_avx(auVar114,auVar24);
            auVar223 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
            auVar22 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,2);
            auVar383._8_4_ = 0xff800000;
            auVar383._0_8_ = 0xff800000ff800000;
            auVar383._12_4_ = 0xff800000;
            auVar383._16_4_ = 0xff800000;
            auVar383._20_4_ = 0xff800000;
            auVar383._24_4_ = 0xff800000;
            auVar383._28_4_ = 0xff800000;
            auVar403._8_4_ = 0x7f800000;
            auVar403._0_8_ = 0x7f8000007f800000;
            auVar403._12_4_ = 0x7f800000;
            auVar403._16_4_ = 0x7f800000;
            auVar403._20_4_ = 0x7f800000;
            auVar403._24_4_ = 0x7f800000;
            auVar403._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar403,auVar383,auVar22);
            auVar200 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar352._16_16_ = auVar223;
            auVar352._0_16_ = auVar200;
            auVar265 = vblendvps_avx(auVar265,auVar25,auVar352);
            auVar25 = vblendvps_avx(auVar383,auVar403,auVar22);
            auVar284 = vblendvps_avx(auVar284,auVar25,auVar352);
            auVar25 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar122._0_4_ = auVar25._0_4_ ^ auVar114._0_4_;
            auVar122._4_4_ = auVar25._4_4_ ^ auVar114._4_4_;
            auVar122._8_4_ = auVar25._8_4_ ^ auVar114._8_4_;
            auVar122._12_4_ = auVar25._12_4_ ^ auVar114._12_4_;
            auVar122._16_4_ = auVar25._16_4_ ^ auVar114._16_4_;
            auVar122._20_4_ = auVar25._20_4_ ^ auVar114._20_4_;
            auVar122._24_4_ = auVar25._24_4_ ^ auVar114._24_4_;
            auVar122._28_4_ = auVar25._28_4_ ^ auVar114._28_4_;
            auVar114 = vorps_avx(auVar22,auVar122);
            auVar25 = vandps_avx(auVar24,auVar114);
          }
          auVar205 = local_7e0._0_28_;
        }
        fVar123 = (ray->dir).field_0.m128[0];
        auVar297 = ZEXT3264(CONCAT428(fVar123,CONCAT424(fVar123,CONCAT420(fVar123,CONCAT416(fVar123,
                                                  CONCAT412(fVar123,CONCAT48(fVar123,CONCAT44(
                                                  fVar123,fVar123))))))));
        fStack_59c = (ray->dir).field_0.m128[1];
        fVar144 = (ray->dir).field_0.m128[2];
        local_5e0._4_4_ = fVar144;
        local_5e0._0_4_ = fVar144;
        fStack_5d8 = fVar144;
        fStack_5d4 = fVar144;
        fStack_5d0 = fVar144;
        fStack_5cc = fVar144;
        fStack_5c8 = fVar144;
        fStack_5c4 = fVar144;
        auVar358 = ZEXT3264(_local_5e0);
        local_480 = _local_740;
        local_460 = vminps_avx(local_4a0,auVar265);
        local_720 = vmaxps_avx(_local_740,auVar284);
        _local_4c0 = local_720;
        auVar114 = vcmpps_avx(_local_740,local_460,2);
        local_560 = vandps_avx(auVar114,auVar113);
        auVar114 = vcmpps_avx(local_720,local_4a0,2);
        local_5c0 = vandps_avx(auVar114,auVar113);
        auVar113 = vorps_avx(local_5c0,local_560);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          auVar113 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_600._0_4_ = auVar25._0_4_ ^ auVar113._0_4_;
          local_600._4_4_ = auVar25._4_4_ ^ auVar113._4_4_;
          local_600._8_4_ = auVar25._8_4_ ^ auVar113._8_4_;
          local_600._12_4_ = auVar25._12_4_ ^ auVar113._12_4_;
          local_600._16_4_ = auVar25._16_4_ ^ auVar113._16_4_;
          local_600._20_4_ = auVar25._20_4_ ^ auVar113._20_4_;
          local_600._24_4_ = auVar25._24_4_ ^ auVar113._24_4_;
          local_600._28_4_ = (uint)auVar25._28_4_ ^ (uint)auVar113._28_4_;
          auVar117._0_4_ =
               fVar123 * auVar205._0_4_ +
               fStack_59c * (float)local_8e0._0_4_ + fVar144 * auVar228._0_4_;
          auVar117._4_4_ =
               fVar123 * auVar205._4_4_ +
               fStack_59c * (float)local_8e0._4_4_ + fVar144 * auVar228._4_4_;
          auVar117._8_4_ =
               fVar123 * auVar205._8_4_ + fStack_59c * fStack_8d8 + fVar144 * auVar228._8_4_;
          auVar117._12_4_ =
               fVar123 * auVar205._12_4_ + fStack_59c * fStack_8d4 + fVar144 * auVar228._12_4_;
          auVar117._16_4_ =
               fVar123 * auVar205._16_4_ + fStack_59c * fStack_8d0 + fVar144 * auVar228._16_4_;
          auVar117._20_4_ =
               fVar123 * auVar205._20_4_ + fStack_59c * fStack_8cc + fVar144 * auVar228._20_4_;
          auVar117._24_4_ =
               fVar123 * auVar205._24_4_ + fStack_59c * fStack_8c8 + fVar144 * auVar228._24_4_;
          auVar117._28_4_ = auVar25._28_4_ + auVar113._28_4_ + 0.0;
          auVar137._8_4_ = 0x7fffffff;
          auVar137._0_8_ = 0x7fffffff7fffffff;
          auVar137._12_4_ = 0x7fffffff;
          auVar137._16_4_ = 0x7fffffff;
          auVar137._20_4_ = 0x7fffffff;
          auVar137._24_4_ = 0x7fffffff;
          auVar137._28_4_ = 0x7fffffff;
          auVar113 = vandps_avx(auVar117,auVar137);
          auVar138._8_4_ = 0x3e99999a;
          auVar138._0_8_ = 0x3e99999a3e99999a;
          auVar138._12_4_ = 0x3e99999a;
          auVar138._16_4_ = 0x3e99999a;
          auVar138._20_4_ = 0x3e99999a;
          auVar138._24_4_ = 0x3e99999a;
          auVar138._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar138,1);
          auVar113 = vorps_avx(auVar113,local_600);
          auVar139._8_4_ = 3;
          auVar139._0_8_ = 0x300000003;
          auVar139._12_4_ = 3;
          auVar139._16_4_ = 3;
          auVar139._20_4_ = 3;
          auVar139._24_4_ = 3;
          auVar139._28_4_ = 3;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar163,auVar139,auVar113);
          local_620 = ZEXT432(local_b24);
          auVar200 = vpshufd_avx(ZEXT416(local_b24),0);
          auVar223 = vpcmpgtd_avx(auVar113._16_16_,auVar200);
          local_640 = auVar200._0_4_;
          fStack_63c = auVar200._4_4_;
          fStack_638 = auVar200._8_4_;
          fStack_634 = auVar200._12_4_;
          auVar200 = vpcmpgtd_avx(auVar113._0_16_,auVar200);
          auVar140._16_16_ = auVar223;
          auVar140._0_16_ = auVar200;
          local_580 = vblendps_avx(ZEXT1632(auVar200),auVar140,0xf0);
          auVar113 = vandnps_avx(local_580,local_560);
          auVar114 = local_560 & ~local_580;
          local_5a0 = fStack_59c;
          fStack_598 = fStack_59c;
          fStack_594 = fStack_59c;
          fStack_590 = fStack_59c;
          fStack_58c = fStack_59c;
          fStack_588 = fStack_59c;
          fStack_584 = fStack_59c;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0x7f,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0xbf,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar114[0x1f]) {
            fVar144 = ray->tfar;
            auVar118._4_4_ = fVar144;
            auVar118._0_4_ = fVar144;
            auVar118._8_4_ = fVar144;
            auVar118._12_4_ = fVar144;
            auVar118._16_4_ = fVar144;
            auVar118._20_4_ = fVar144;
            auVar118._24_4_ = fVar144;
            auVar118._28_4_ = fVar144;
            local_500 = auVar113;
          }
          else {
            local_700._4_4_ = (float)local_9e0._4_4_ + (float)local_740._4_4_;
            local_700._0_4_ = (float)local_9e0._0_4_ + (float)local_740._0_4_;
            fStack_6f8 = fStack_9d8 + fStack_738;
            fStack_6f4 = fStack_9d4 + fStack_734;
            fStack_6f0 = fStack_9d0 + fStack_730;
            fStack_6ec = fStack_9cc + fStack_72c;
            fStack_6e8 = fStack_9c8 + fStack_728;
            fStack_6e4 = fStack_9c4 + fStack_724;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar114 = vblendvps_avx(auVar119,_local_740,auVar113);
              auVar25 = vshufps_avx(auVar114,auVar114,0xb1);
              auVar25 = vminps_avx(auVar114,auVar25);
              auVar22 = vshufpd_avx(auVar25,auVar25,5);
              auVar25 = vminps_avx(auVar25,auVar22);
              auVar22 = vperm2f128_avx(auVar25,auVar25,1);
              auVar25 = vminps_avx(auVar25,auVar22);
              auVar25 = vcmpps_avx(auVar114,auVar25,0);
              auVar22 = auVar113 & auVar25;
              auVar114 = auVar113;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar25,auVar113);
              }
              uVar89 = vmovmskps_avx(auVar114);
              uVar92 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar90 = (ulong)uVar92;
              local_500 = auVar113;
              *(undefined4 *)(local_500 + uVar90 * 4) = 0;
              aVar9 = (ray->dir).field_0.field_1;
              local_7c0 = aVar9.x;
              fStack_7bc = aVar9.y;
              fStack_7b8 = aVar9.z;
              aStack_7b4 = aVar9.field_3;
              auVar223 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
              fVar144 = local_1a0[uVar90];
              uVar92 = *(uint *)(local_480 + uVar90 * 4);
              if (auVar223._0_4_ < 0.0) {
                fVar146 = sqrtf(auVar223._0_4_);
              }
              else {
                auVar223 = vsqrtss_avx(auVar223,auVar223);
                fVar146 = auVar223._0_4_;
              }
              auVar200 = vminps_avx(_local_920,_local_940);
              auVar223 = vmaxps_avx(_local_920,_local_940);
              auVar108 = vminps_avx(_local_930,_local_950);
              auVar131 = vminps_avx(auVar200,auVar108);
              auVar200 = vmaxps_avx(_local_930,_local_950);
              auVar108 = vmaxps_avx(auVar223,auVar200);
              auVar194._8_4_ = 0x7fffffff;
              auVar194._0_8_ = 0x7fffffff7fffffff;
              auVar194._12_4_ = 0x7fffffff;
              auVar223 = vandps_avx(auVar131,auVar194);
              auVar200 = vandps_avx(auVar108,auVar194);
              auVar223 = vmaxps_avx(auVar223,auVar200);
              auVar200 = vmovshdup_avx(auVar223);
              auVar200 = vmaxss_avx(auVar200,auVar223);
              auVar223 = vshufpd_avx(auVar223,auVar223,1);
              auVar223 = vmaxss_avx(auVar223,auVar200);
              fVar149 = auVar223._0_4_ * 1.9073486e-06;
              local_820._0_4_ = fVar146 * 1.9073486e-06;
              local_6e0._0_16_ = vshufps_avx(auVar108,auVar108,0xff);
              auVar223 = vinsertps_avx(ZEXT416(uVar92),ZEXT416((uint)fVar144),0x10);
              auVar358 = ZEXT1664(auVar223);
              bVar98 = true;
              uVar90 = 0;
              do {
                auVar132 = auVar358._0_16_;
                auVar223 = vshufps_avx(auVar132,auVar132,0);
                auVar103._0_4_ = auVar223._0_4_ * local_7c0 + 0.0;
                auVar103._4_4_ = auVar223._4_4_ * fStack_7bc + 0.0;
                auVar103._8_4_ = auVar223._8_4_ * fStack_7b8 + 0.0;
                auVar103._12_4_ = auVar223._12_4_ * aStack_7b4.w + 0.0;
                auVar200 = vmovshdup_avx(auVar132);
                fVar213 = auVar200._0_4_;
                fVar211 = 1.0 - fVar213;
                fVar146 = fVar213 * fVar213;
                fVar190 = fVar213 * 3.0;
                fVar144 = fVar190 + -5.0;
                auVar223 = ZEXT416((uint)(fVar213 * fVar213 * -fVar211 * 0.5));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar108 = ZEXT416((uint)((fVar211 * fVar211 * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar131 = ZEXT416((uint)((fVar146 * fVar144 + 2.0) * 0.5));
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                auVar128 = ZEXT416((uint)(fVar211 * fVar211 * -fVar213 * 0.5));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar155._0_4_ =
                     auVar128._0_4_ * (float)local_920._0_4_ +
                     auVar131._0_4_ * (float)local_940._0_4_ +
                     auVar108._0_4_ * (float)local_930._0_4_ +
                     auVar223._0_4_ * (float)local_950._0_4_;
                auVar155._4_4_ =
                     auVar128._4_4_ * (float)local_920._4_4_ +
                     auVar131._4_4_ * (float)local_940._4_4_ +
                     auVar108._4_4_ * (float)local_930._4_4_ +
                     auVar223._4_4_ * (float)local_950._4_4_;
                auVar155._8_4_ =
                     auVar128._8_4_ * fStack_918 +
                     auVar131._8_4_ * fStack_938 +
                     auVar108._8_4_ * fStack_928 + auVar223._8_4_ * fStack_948;
                auVar155._12_4_ =
                     auVar128._12_4_ * fStack_914 +
                     auVar131._12_4_ * fStack_934 +
                     auVar108._12_4_ * fStack_924 + auVar223._12_4_ * fStack_944;
                local_7e0._0_16_ = auVar155;
                auVar223 = vsubps_avx(auVar103,auVar155);
                _local_8e0 = auVar223;
                auVar223 = vdpps_avx(auVar223,auVar223,0x7f);
                local_980._0_16_ = ZEXT416((uint)(fVar190 + -1.0));
                fVar212 = auVar223._0_4_;
                if (fVar212 < 0.0) {
                  local_9a0._0_16_ = auVar200;
                  local_800._0_4_ = fVar146;
                  local_9c0._0_16_ = ZEXT416((uint)fVar211);
                  local_840._0_4_ = fVar190;
                  local_860._0_4_ = fVar213 * 9.0;
                  local_880._0_4_ = fVar144;
                  local_6c0._0_4_ = fVar211 * -2.0;
                  fVar215 = sqrtf(fVar212);
                  fVar235 = (float)local_860._0_4_;
                  fVar234 = (float)local_6c0._0_4_;
                  fVar190 = (float)local_840._0_4_;
                  auVar200 = local_9a0._0_16_;
                  fVar144 = (float)local_880._0_4_;
                  fVar146 = (float)local_9c0._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar223,auVar223);
                  fVar215 = auVar108._0_4_;
                  fVar235 = fVar213 * 9.0;
                  fVar234 = fVar211 * -2.0;
                  local_800._0_4_ = fVar146;
                  fVar146 = fVar211;
                }
                fVar236 = auVar200._0_4_;
                auVar200 = ZEXT416((uint)(((float)local_800._0_4_ + fVar236 * fVar234) * 0.5));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar108 = ZEXT416((uint)(((fVar146 + fVar146) * (fVar190 + 2.0) +
                                          fVar146 * fVar146 * -3.0) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar131 = ZEXT416((uint)((fVar144 * (fVar236 + fVar236) + fVar236 * fVar190) * 0.5)
                                  );
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                auVar128 = ZEXT416((uint)((fVar236 * (fVar146 + fVar146) - fVar211 * fVar211) * 0.5)
                                  );
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar346._0_4_ =
                     (float)local_920._0_4_ * auVar128._0_4_ +
                     (float)local_940._0_4_ * auVar131._0_4_ +
                     (float)local_950._0_4_ * auVar200._0_4_ +
                     (float)local_930._0_4_ * auVar108._0_4_;
                auVar346._4_4_ =
                     (float)local_920._4_4_ * auVar128._4_4_ +
                     (float)local_940._4_4_ * auVar131._4_4_ +
                     (float)local_950._4_4_ * auVar200._4_4_ +
                     (float)local_930._4_4_ * auVar108._4_4_;
                auVar346._8_4_ =
                     fStack_918 * auVar128._8_4_ +
                     fStack_938 * auVar131._8_4_ +
                     fStack_948 * auVar200._8_4_ + fStack_928 * auVar108._8_4_;
                auVar346._12_4_ =
                     fStack_914 * auVar128._12_4_ +
                     fStack_934 * auVar131._12_4_ +
                     fStack_944 * auVar200._12_4_ + fStack_924 * auVar108._12_4_;
                auVar128 = vpermilps_avx(local_980._0_16_,0);
                auVar19 = vpermilps_avx(ZEXT416((uint)(fVar213 * -9.0 + 4.0)),0);
                auVar200 = vshufps_avx(ZEXT416((uint)(fVar235 + -5.0)),
                                       ZEXT416((uint)(fVar235 + -5.0)),0);
                auVar108 = ZEXT416((uint)(fVar236 * -3.0 + 2.0));
                auVar131 = vshufps_avx(auVar108,auVar108,0);
                auVar108 = vdpps_avx(auVar346,auVar346,0x7f);
                auVar129._0_4_ =
                     (float)local_920._0_4_ * auVar131._0_4_ +
                     (float)local_940._0_4_ * auVar200._0_4_ +
                     (float)local_930._0_4_ * auVar19._0_4_ +
                     (float)local_950._0_4_ * auVar128._0_4_;
                auVar129._4_4_ =
                     (float)local_920._4_4_ * auVar131._4_4_ +
                     (float)local_940._4_4_ * auVar200._4_4_ +
                     (float)local_930._4_4_ * auVar19._4_4_ +
                     (float)local_950._4_4_ * auVar128._4_4_;
                auVar129._8_4_ =
                     fStack_918 * auVar131._8_4_ +
                     fStack_938 * auVar200._8_4_ +
                     fStack_928 * auVar19._8_4_ + fStack_948 * auVar128._8_4_;
                auVar129._12_4_ =
                     fStack_914 * auVar131._12_4_ +
                     fStack_934 * auVar200._12_4_ +
                     fStack_924 * auVar19._12_4_ + fStack_944 * auVar128._12_4_;
                auVar200 = vblendps_avx(auVar108,_DAT_01f7aa10,0xe);
                auVar131 = vrsqrtss_avx(auVar200,auVar200);
                fVar146 = auVar131._0_4_;
                fVar144 = auVar108._0_4_;
                auVar131 = vdpps_avx(auVar346,auVar129,0x7f);
                auVar128 = vshufps_avx(auVar108,auVar108,0);
                auVar130._0_4_ = auVar129._0_4_ * auVar128._0_4_;
                auVar130._4_4_ = auVar129._4_4_ * auVar128._4_4_;
                auVar130._8_4_ = auVar129._8_4_ * auVar128._8_4_;
                auVar130._12_4_ = auVar129._12_4_ * auVar128._12_4_;
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                auVar219._0_4_ = auVar346._0_4_ * auVar131._0_4_;
                auVar219._4_4_ = auVar346._4_4_ * auVar131._4_4_;
                auVar219._8_4_ = auVar346._8_4_ * auVar131._8_4_;
                auVar219._12_4_ = auVar346._12_4_ * auVar131._12_4_;
                auVar19 = vsubps_avx(auVar130,auVar219);
                auVar131 = vrcpss_avx(auVar200,auVar200);
                auVar200 = vmaxss_avx(ZEXT416((uint)fVar149),
                                      ZEXT416((uint)(auVar358._0_4_ * (float)local_820._0_4_)));
                auVar131 = ZEXT416((uint)(auVar131._0_4_ * (2.0 - fVar144 * auVar131._0_4_)));
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                uVar76 = CONCAT44(auVar346._4_4_,auVar346._0_4_);
                auVar281._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar281._8_4_ = -auVar346._8_4_;
                auVar281._12_4_ = -auVar346._12_4_;
                auVar128 = ZEXT416((uint)(fVar146 * 1.5 +
                                         fVar144 * -0.5 * fVar146 * fVar146 * fVar146));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar195._0_4_ = auVar128._0_4_ * auVar19._0_4_ * auVar131._0_4_;
                auVar195._4_4_ = auVar128._4_4_ * auVar19._4_4_ * auVar131._4_4_;
                auVar195._8_4_ = auVar128._8_4_ * auVar19._8_4_ * auVar131._8_4_;
                auVar195._12_4_ = auVar128._12_4_ * auVar19._12_4_ * auVar131._12_4_;
                local_800._0_4_ = auVar346._0_4_ * auVar128._0_4_;
                local_800._4_4_ = auVar346._4_4_ * auVar128._4_4_;
                local_800._8_4_ = auVar346._8_4_ * auVar128._8_4_;
                local_800._12_4_ = auVar346._12_4_ * auVar128._12_4_;
                local_980._0_4_ = auVar200._0_4_;
                if (fVar144 < 0.0) {
                  local_9a0._0_16_ = auVar281;
                  local_9c0._0_16_ = auVar195;
                  fVar146 = sqrtf(fVar144);
                  auVar195 = local_9c0._0_16_;
                  auVar281 = local_9a0._0_16_;
                  fVar144 = (float)local_980._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar146 = auVar108._0_4_;
                  fVar144 = auVar200._0_4_;
                }
                auVar200 = vdpps_avx(_local_8e0,local_800._0_16_,0x7f);
                local_9a0._0_4_ =
                     (fVar149 / fVar146) * (fVar215 + 1.0) + fVar144 + fVar215 * fVar149;
                auVar108 = vdpps_avx(auVar281,local_800._0_16_,0x7f);
                auVar131 = vdpps_avx(_local_8e0,auVar195,0x7f);
                auVar81._4_4_ = fStack_7bc;
                auVar81._0_4_ = local_7c0;
                auVar81._8_4_ = fStack_7b8;
                auVar81._12_4_ = aStack_7b4.a;
                auVar128 = vdpps_avx(auVar81,local_800._0_16_,0x7f);
                auVar19 = vdpps_avx(_local_8e0,auVar281,0x7f);
                fVar146 = auVar108._0_4_ + auVar131._0_4_;
                fVar190 = auVar200._0_4_;
                auVar104._0_4_ = fVar190 * fVar190;
                auVar104._4_4_ = auVar200._4_4_ * auVar200._4_4_;
                auVar104._8_4_ = auVar200._8_4_ * auVar200._8_4_;
                auVar104._12_4_ = auVar200._12_4_ * auVar200._12_4_;
                auVar131 = vsubps_avx(auVar223,auVar104);
                local_800._0_16_ = ZEXT416((uint)fVar146);
                auVar108 = vdpps_avx(_local_8e0,auVar81,0x7f);
                fVar211 = auVar19._0_4_ - fVar190 * fVar146;
                fVar190 = auVar108._0_4_ - fVar190 * auVar128._0_4_;
                auVar108 = vrsqrtss_avx(auVar131,auVar131);
                fVar213 = auVar131._0_4_;
                fVar146 = auVar108._0_4_;
                fVar146 = fVar146 * 1.5 + fVar213 * -0.5 * fVar146 * fVar146 * fVar146;
                if (fVar213 < 0.0) {
                  local_9c0._0_16_ = auVar128;
                  local_840._0_4_ = fVar211;
                  local_860._0_4_ = fVar190;
                  local_880._0_4_ = fVar146;
                  fVar213 = sqrtf(fVar213);
                  fVar146 = (float)local_880._0_4_;
                  fVar211 = (float)local_840._0_4_;
                  fVar190 = (float)local_860._0_4_;
                  auVar128 = local_9c0._0_16_;
                  fVar144 = (float)local_980._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar131,auVar131);
                  fVar213 = auVar108._0_4_;
                }
                auVar297 = ZEXT1664(auVar223);
                auVar19 = vpermilps_avx(local_7e0._0_16_,0xff);
                auVar20 = vpermilps_avx(auVar346,0xff);
                fVar211 = fVar211 * fVar146 - auVar20._0_4_;
                auVar220._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = auVar128._8_4_ ^ 0x80000000;
                auVar220._12_4_ = auVar128._12_4_ ^ 0x80000000;
                auVar243._0_4_ = -fVar211;
                auVar243._4_4_ = 0x80000000;
                auVar243._8_4_ = 0x80000000;
                auVar243._12_4_ = 0x80000000;
                auVar108 = vinsertps_avx(auVar243,ZEXT416((uint)(fVar190 * fVar146)),0x1c);
                auVar128 = vmovsldup_avx(ZEXT416((uint)(local_800._0_4_ * fVar190 * fVar146 -
                                                       auVar128._0_4_ * fVar211)));
                auVar108 = vdivps_avx(auVar108,auVar128);
                auVar131 = vinsertps_avx(local_800._0_16_,auVar220,0x10);
                auVar131 = vdivps_avx(auVar131,auVar128);
                auVar128 = vmovsldup_avx(auVar200);
                auVar135 = ZEXT416((uint)(fVar213 - auVar19._0_4_));
                auVar19 = vmovsldup_avx(auVar135);
                auVar156._0_4_ = auVar128._0_4_ * auVar108._0_4_ + auVar19._0_4_ * auVar131._0_4_;
                auVar156._4_4_ = auVar128._4_4_ * auVar108._4_4_ + auVar19._4_4_ * auVar131._4_4_;
                auVar156._8_4_ = auVar128._8_4_ * auVar108._8_4_ + auVar19._8_4_ * auVar131._8_4_;
                auVar156._12_4_ =
                     auVar128._12_4_ * auVar108._12_4_ + auVar19._12_4_ * auVar131._12_4_;
                auVar108 = vsubps_avx(auVar132,auVar156);
                auVar358 = ZEXT1664(auVar108);
                auVar157._8_4_ = 0x7fffffff;
                auVar157._0_8_ = 0x7fffffff7fffffff;
                auVar157._12_4_ = 0x7fffffff;
                auVar200 = vandps_avx(auVar200,auVar157);
                fVar372 = (float)local_9e0._0_4_;
                fVar374 = (float)local_9e0._4_4_;
                fVar189 = fStack_9d8;
                fVar258 = fStack_9d4;
                fVar269 = fStack_9d0;
                fVar270 = fStack_9cc;
                fVar271 = fStack_9c8;
                fVar272 = fStack_9c4;
                if (auVar200._0_4_ < (float)local_9a0._0_4_) {
                  auVar196._8_4_ = 0x7fffffff;
                  auVar196._0_8_ = 0x7fffffff7fffffff;
                  auVar196._12_4_ = 0x7fffffff;
                  auVar200 = vandps_avx(auVar135,auVar196);
                  if (auVar200._0_4_ <
                      (float)local_6e0._0_4_ * 1.9073486e-06 + fVar144 + (float)local_9a0._0_4_) {
                    fVar144 = auVar108._0_4_ + (float)local_7a0._0_4_;
                    bVar87 = 0;
                    if (((ray->org).field_0.m128[3] <= fVar144) &&
                       (fVar146 = ray->tfar, bVar87 = 0, fVar144 <= fVar146)) {
                      auVar200 = vmovshdup_avx(auVar108);
                      fVar149 = auVar200._0_4_;
                      bVar87 = 0;
                      if ((0.0 <= fVar149) && (fVar149 <= 1.0)) {
                        auVar200 = vrsqrtss_avx(auVar223,auVar223);
                        fVar190 = auVar200._0_4_;
                        pGVar13 = (context->scene->geometries).items[uVar88].ptr;
                        if ((pGVar13->mask & ray->mask) == 0) {
                          bVar87 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar87 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0))
                        {
                          auVar200 = ZEXT416((uint)(fVar190 * 1.5 +
                                                   fVar212 * -0.5 * fVar190 * fVar190 * fVar190));
                          auVar200 = vshufps_avx(auVar200,auVar200,0);
                          auVar197._0_4_ = auVar200._0_4_ * (float)local_8e0._0_4_;
                          auVar197._4_4_ = auVar200._4_4_ * (float)local_8e0._4_4_;
                          auVar197._8_4_ = auVar200._8_4_ * fStack_8d8;
                          auVar197._12_4_ = auVar200._12_4_ * fStack_8d4;
                          auVar105._0_4_ = auVar346._0_4_ + auVar20._0_4_ * auVar197._0_4_;
                          auVar105._4_4_ = auVar346._4_4_ + auVar20._4_4_ * auVar197._4_4_;
                          auVar105._8_4_ = auVar346._8_4_ + auVar20._8_4_ * auVar197._8_4_;
                          auVar105._12_4_ = auVar346._12_4_ + auVar20._12_4_ * auVar197._12_4_;
                          auVar200 = vshufps_avx(auVar197,auVar197,0xc9);
                          auVar131 = vshufps_avx(auVar346,auVar346,0xc9);
                          auVar198._0_4_ = auVar131._0_4_ * auVar197._0_4_;
                          auVar198._4_4_ = auVar131._4_4_ * auVar197._4_4_;
                          auVar198._8_4_ = auVar131._8_4_ * auVar197._8_4_;
                          auVar198._12_4_ = auVar131._12_4_ * auVar197._12_4_;
                          auVar221._0_4_ = auVar346._0_4_ * auVar200._0_4_;
                          auVar221._4_4_ = auVar346._4_4_ * auVar200._4_4_;
                          auVar221._8_4_ = auVar346._8_4_ * auVar200._8_4_;
                          auVar221._12_4_ = auVar346._12_4_ * auVar200._12_4_;
                          auVar128 = vsubps_avx(auVar221,auVar198);
                          auVar200 = vshufps_avx(auVar128,auVar128,0xc9);
                          auVar131 = vshufps_avx(auVar105,auVar105,0xc9);
                          auVar222._0_4_ = auVar131._0_4_ * auVar200._0_4_;
                          auVar222._4_4_ = auVar131._4_4_ * auVar200._4_4_;
                          auVar222._8_4_ = auVar131._8_4_ * auVar200._8_4_;
                          auVar222._12_4_ = auVar131._12_4_ * auVar200._12_4_;
                          auVar200 = vshufps_avx(auVar128,auVar128,0xd2);
                          auVar106._0_4_ = auVar105._0_4_ * auVar200._0_4_;
                          auVar106._4_4_ = auVar105._4_4_ * auVar200._4_4_;
                          auVar106._8_4_ = auVar105._8_4_ * auVar200._8_4_;
                          auVar106._12_4_ = auVar105._12_4_ * auVar200._12_4_;
                          auVar131 = vsubps_avx(auVar222,auVar106);
                          auVar200 = vshufps_avx(auVar131,auVar131,0xe9);
                          local_8c0 = vmovlps_avx(auVar200);
                          local_8b8 = auVar131._0_4_;
                          local_8b0 = 0;
                          local_8ac = (undefined4)local_888;
                          local_8a4 = context->user->instID[0];
                          local_8a0 = context->user->instPrimID[0];
                          ray->tfar = fVar144;
                          local_6a0._0_4_ = 0xffffffff;
                          local_910.valid = (int *)local_6a0;
                          local_910.geometryUserPtr = pGVar13->userPtr;
                          local_910.context = context->user;
                          local_910.hit = (RTCHitN *)&local_8c0;
                          local_910.N = 1;
                          local_910.ray = (RTCRayN *)ray;
                          local_8b4 = fVar149;
                          local_8a8 = uVar88;
                          if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f9442a:
                            p_Var16 = context->args->filter;
                            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar297 = ZEXT1664(auVar297._0_16_);
                              auVar358 = ZEXT1664(auVar358._0_16_);
                              (*p_Var16)(&local_910);
                              if (*local_910.valid == 0) goto LAB_00f94477;
                            }
                            bVar87 = 1;
                          }
                          else {
                            auVar297 = ZEXT1664(auVar223);
                            auVar358 = ZEXT1664(auVar108);
                            (*pGVar13->occlusionFilterN)(&local_910);
                            if (*local_910.valid != 0) goto LAB_00f9442a;
LAB_00f94477:
                            ray->tfar = fVar146;
                            bVar87 = 0;
                          }
                          fVar372 = (float)local_9e0._0_4_;
                          fVar374 = (float)local_9e0._4_4_;
                          fVar189 = fStack_9d8;
                          fVar258 = fStack_9d4;
                          fVar269 = fStack_9d0;
                          fVar270 = fStack_9cc;
                          fVar271 = fStack_9c8;
                          fVar272 = fStack_9c4;
                        }
                      }
                    }
                    goto LAB_00f941f0;
                  }
                }
                bVar98 = uVar90 < 4;
                uVar90 = uVar90 + 1;
              } while (uVar90 != 5);
              bVar98 = false;
              bVar87 = 5;
LAB_00f941f0:
              bVar95 = (bool)(bVar95 | bVar98 & bVar87);
              fVar144 = ray->tfar;
              auVar118._4_4_ = fVar144;
              auVar118._0_4_ = fVar144;
              auVar118._8_4_ = fVar144;
              auVar118._12_4_ = fVar144;
              auVar118._16_4_ = fVar144;
              auVar118._20_4_ = fVar144;
              auVar118._24_4_ = fVar144;
              auVar118._28_4_ = fVar144;
              auVar114 = vcmpps_avx(_local_700,auVar118,2);
              auVar113 = vandps_avx(auVar114,local_500);
              auVar114 = local_500 & auVar114;
              local_500 = auVar113;
            } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar114 >> 0x7f,0) != '\0') ||
                       (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar114 >> 0xbf,0) != '\0') ||
                     (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar114[0x1f] < '\0');
          }
          auVar25 = _local_4c0;
          auVar141._0_4_ =
               fVar123 * (float)local_760._0_4_ +
               local_5a0 * (float)local_780._0_4_ + (float)local_5e0._0_4_ * (float)local_680._0_4_;
          auVar141._4_4_ =
               fVar123 * (float)local_760._4_4_ +
               fStack_59c * (float)local_780._4_4_ + (float)local_5e0._4_4_ * (float)local_680._4_4_
          ;
          auVar141._8_4_ = fVar123 * fStack_758 + fStack_598 * fStack_778 + fStack_5d8 * fStack_678;
          auVar141._12_4_ = fVar123 * fStack_754 + fStack_594 * fStack_774 + fStack_5d4 * fStack_674
          ;
          auVar141._16_4_ = fVar123 * fStack_750 + fStack_590 * fStack_770 + fStack_5d0 * fStack_670
          ;
          auVar141._20_4_ = fVar123 * fStack_74c + fStack_58c * fStack_76c + fStack_5cc * fStack_66c
          ;
          auVar141._24_4_ = fVar123 * fStack_748 + fStack_588 * fStack_768 + fStack_5c8 * fStack_668
          ;
          auVar141._28_4_ = fStack_584 + fStack_584 + fStack_5c4;
          auVar164._8_4_ = 0x7fffffff;
          auVar164._0_8_ = 0x7fffffff7fffffff;
          auVar164._12_4_ = 0x7fffffff;
          auVar164._16_4_ = 0x7fffffff;
          auVar164._20_4_ = 0x7fffffff;
          auVar164._24_4_ = 0x7fffffff;
          auVar164._28_4_ = 0x7fffffff;
          auVar113 = vandps_avx(auVar141,auVar164);
          auVar165._8_4_ = 0x3e99999a;
          auVar165._0_8_ = 0x3e99999a3e99999a;
          auVar165._12_4_ = 0x3e99999a;
          auVar165._16_4_ = 0x3e99999a;
          auVar165._20_4_ = 0x3e99999a;
          auVar165._24_4_ = 0x3e99999a;
          auVar165._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar165,1);
          auVar114 = vorps_avx(auVar113,local_600);
          auVar166._0_4_ = fVar372 + local_720._0_4_;
          auVar166._4_4_ = fVar374 + local_720._4_4_;
          auVar166._8_4_ = fVar189 + local_720._8_4_;
          auVar166._12_4_ = fVar258 + local_720._12_4_;
          auVar166._16_4_ = fVar269 + local_720._16_4_;
          auVar166._20_4_ = fVar270 + local_720._20_4_;
          auVar166._24_4_ = fVar271 + local_720._24_4_;
          auVar166._28_4_ = fVar272 + local_720._28_4_;
          auVar113 = vcmpps_avx(auVar166,auVar118,2);
          _local_780 = vandps_avx(auVar113,local_5c0);
          auVar167._8_4_ = 3;
          auVar167._0_8_ = 0x300000003;
          auVar167._12_4_ = 3;
          auVar167._16_4_ = 3;
          auVar167._20_4_ = 3;
          auVar167._24_4_ = 3;
          auVar167._28_4_ = 3;
          auVar210._8_4_ = 2;
          auVar210._0_8_ = 0x200000002;
          auVar210._12_4_ = 2;
          auVar210._16_4_ = 2;
          auVar210._20_4_ = 2;
          auVar210._24_4_ = 2;
          auVar210._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar210,auVar167,auVar114);
          auVar84._4_4_ = fStack_63c;
          auVar84._0_4_ = local_640;
          auVar84._8_4_ = fStack_638;
          auVar84._12_4_ = fStack_634;
          auVar223 = vpcmpgtd_avx(auVar113._16_16_,auVar84);
          auVar200 = vpshufd_avx(local_620._0_16_,0);
          auVar200 = vpcmpgtd_avx(auVar113._0_16_,auVar200);
          auVar168._16_16_ = auVar223;
          auVar168._0_16_ = auVar118._0_16_;
          _local_760 = vblendps_avx(ZEXT1632(auVar200),auVar168,0xf0);
          auVar113 = vandnps_avx(_local_760,_local_780);
          auVar114 = _local_780 & ~_local_760;
          local_6a0 = auVar113;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            local_700._4_4_ = fVar374 + local_4c0._4_4_;
            local_700._0_4_ = fVar372 + local_4c0._0_4_;
            fStack_6f8 = fVar189 + local_4c0._8_4_;
            fStack_6f4 = fVar258 + local_4c0._12_4_;
            fStack_6f0 = fVar269 + local_4c0._16_4_;
            fStack_6ec = fVar270 + local_4c0._20_4_;
            fStack_6e8 = fVar271 + local_4c0._24_4_;
            fStack_6e4 = fVar272 + local_4c0._28_4_;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar114 = vblendvps_avx(auVar120,auVar25,auVar113);
              auVar22 = vshufps_avx(auVar114,auVar114,0xb1);
              auVar22 = vminps_avx(auVar114,auVar22);
              auVar23 = vshufpd_avx(auVar22,auVar22,5);
              auVar22 = vminps_avx(auVar22,auVar23);
              auVar23 = vperm2f128_avx(auVar22,auVar22,1);
              auVar22 = vminps_avx(auVar22,auVar23);
              auVar22 = vcmpps_avx(auVar114,auVar22,0);
              auVar23 = auVar113 & auVar22;
              auVar114 = auVar113;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar22,auVar113);
              }
              uVar89 = vmovmskps_avx(auVar114);
              uVar92 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar90 = (ulong)uVar92;
              local_6a0 = auVar113;
              *(undefined4 *)(local_6a0 + uVar90 * 4) = 0;
              aVar9 = (ray->dir).field_0.field_1;
              local_7c0 = aVar9.x;
              fStack_7bc = aVar9.y;
              fStack_7b8 = aVar9.z;
              aStack_7b4 = aVar9.field_3;
              auVar223 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
              fVar123 = local_1c0[uVar90];
              uVar92 = *(uint *)(local_4a0 + uVar90 * 4);
              if (auVar223._0_4_ < 0.0) {
                fVar144 = sqrtf(auVar223._0_4_);
              }
              else {
                auVar223 = vsqrtss_avx(auVar223,auVar223);
                fVar144 = auVar223._0_4_;
              }
              auVar200 = vminps_avx(_local_920,_local_940);
              auVar223 = vmaxps_avx(_local_920,_local_940);
              auVar108 = vminps_avx(_local_930,_local_950);
              auVar131 = vminps_avx(auVar200,auVar108);
              auVar200 = vmaxps_avx(_local_930,_local_950);
              auVar108 = vmaxps_avx(auVar223,auVar200);
              auVar199._8_4_ = 0x7fffffff;
              auVar199._0_8_ = 0x7fffffff7fffffff;
              auVar199._12_4_ = 0x7fffffff;
              auVar223 = vandps_avx(auVar131,auVar199);
              auVar200 = vandps_avx(auVar108,auVar199);
              auVar223 = vmaxps_avx(auVar223,auVar200);
              auVar200 = vmovshdup_avx(auVar223);
              auVar200 = vmaxss_avx(auVar200,auVar223);
              auVar223 = vshufpd_avx(auVar223,auVar223,1);
              auVar223 = vmaxss_avx(auVar223,auVar200);
              fVar146 = auVar223._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar144 * 1.9073486e-06;
              local_6e0._0_16_ = vshufps_avx(auVar108,auVar108,0xff);
              auVar223 = vinsertps_avx(ZEXT416(uVar92),ZEXT416((uint)fVar123),0x10);
              auVar358 = ZEXT1664(auVar223);
              bVar98 = true;
              uVar90 = 0;
              do {
                auVar128 = auVar358._0_16_;
                auVar223 = vshufps_avx(auVar128,auVar128,0);
                auVar107._0_4_ = auVar223._0_4_ * local_7c0 + 0.0;
                auVar107._4_4_ = auVar223._4_4_ * fStack_7bc + 0.0;
                auVar107._8_4_ = auVar223._8_4_ * fStack_7b8 + 0.0;
                auVar107._12_4_ = auVar223._12_4_ * aStack_7b4.w + 0.0;
                local_9a0._0_16_ = vmovshdup_avx(auVar128);
                fVar212 = local_9a0._0_4_;
                fVar190 = 1.0 - fVar212;
                fVar144 = fVar212 * fVar212;
                fVar149 = fVar212 * 3.0;
                fVar123 = fVar149 + -5.0;
                auVar223 = ZEXT416((uint)(fVar212 * fVar212 * -fVar190 * 0.5));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar200 = ZEXT416((uint)((fVar190 * fVar190 * (fVar190 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar108 = ZEXT416((uint)((fVar144 * fVar123 + 2.0) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar131 = ZEXT416((uint)(fVar190 * fVar190 * -fVar212 * 0.5));
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                auVar158._0_4_ =
                     auVar131._0_4_ * (float)local_920._0_4_ +
                     auVar108._0_4_ * (float)local_940._0_4_ +
                     auVar200._0_4_ * (float)local_930._0_4_ +
                     auVar223._0_4_ * (float)local_950._0_4_;
                auVar158._4_4_ =
                     auVar131._4_4_ * (float)local_920._4_4_ +
                     auVar108._4_4_ * (float)local_940._4_4_ +
                     auVar200._4_4_ * (float)local_930._4_4_ +
                     auVar223._4_4_ * (float)local_950._4_4_;
                auVar158._8_4_ =
                     auVar131._8_4_ * fStack_918 +
                     auVar108._8_4_ * fStack_938 +
                     auVar200._8_4_ * fStack_928 + auVar223._8_4_ * fStack_948;
                auVar158._12_4_ =
                     auVar131._12_4_ * fStack_914 +
                     auVar108._12_4_ * fStack_934 +
                     auVar200._12_4_ * fStack_924 + auVar223._12_4_ * fStack_944;
                local_7e0._0_16_ = auVar158;
                auVar223 = vsubps_avx(auVar107,auVar158);
                _local_8e0 = auVar223;
                auVar223 = vdpps_avx(auVar223,auVar223,0x7f);
                local_980._0_16_ = ZEXT416((uint)(fVar149 + -1.0));
                fVar211 = auVar223._0_4_;
                if (fVar211 < 0.0) {
                  local_820._0_4_ = fVar144;
                  local_9c0._0_16_ = ZEXT416((uint)fVar190);
                  local_840._0_4_ = fVar149;
                  local_860._0_4_ = fVar212 * 9.0;
                  local_880._0_4_ = fVar123;
                  local_6c0._0_4_ = fVar190 * -2.0;
                  fVar213 = sqrtf(fVar211);
                  fVar215 = (float)local_6c0._0_4_;
                  fVar144 = (float)local_820._0_4_;
                  fVar149 = (float)local_840._0_4_;
                  fVar234 = (float)local_860._0_4_;
                  fVar123 = (float)local_880._0_4_;
                  fVar235 = (float)local_9c0._0_4_;
                }
                else {
                  auVar200 = vsqrtss_avx(auVar223,auVar223);
                  fVar213 = auVar200._0_4_;
                  fVar215 = fVar190 * -2.0;
                  fVar234 = fVar212 * 9.0;
                  fVar235 = fVar190;
                }
                fVar236 = local_9a0._0_4_;
                auVar200 = ZEXT416((uint)((fVar144 + fVar236 * fVar215) * 0.5));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar108 = ZEXT416((uint)(((fVar235 + fVar235) * (fVar149 + 2.0) +
                                          fVar235 * fVar235 * -3.0) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar131 = ZEXT416((uint)((fVar123 * (fVar236 + fVar236) + fVar236 * fVar149) * 0.5)
                                  );
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                auVar132 = ZEXT416((uint)((fVar236 * (fVar235 + fVar235) - fVar190 * fVar190) * 0.5)
                                  );
                auVar132 = vshufps_avx(auVar132,auVar132,0);
                auVar347._0_4_ =
                     (float)local_920._0_4_ * auVar132._0_4_ +
                     (float)local_940._0_4_ * auVar131._0_4_ +
                     (float)local_950._0_4_ * auVar200._0_4_ +
                     (float)local_930._0_4_ * auVar108._0_4_;
                auVar347._4_4_ =
                     (float)local_920._4_4_ * auVar132._4_4_ +
                     (float)local_940._4_4_ * auVar131._4_4_ +
                     (float)local_950._4_4_ * auVar200._4_4_ +
                     (float)local_930._4_4_ * auVar108._4_4_;
                auVar347._8_4_ =
                     fStack_918 * auVar132._8_4_ +
                     fStack_938 * auVar131._8_4_ +
                     fStack_948 * auVar200._8_4_ + fStack_928 * auVar108._8_4_;
                auVar347._12_4_ =
                     fStack_914 * auVar132._12_4_ +
                     fStack_934 * auVar131._12_4_ +
                     fStack_944 * auVar200._12_4_ + fStack_924 * auVar108._12_4_;
                auVar132 = vpermilps_avx(local_980._0_16_,0);
                auVar19 = vpermilps_avx(ZEXT416((uint)(fVar212 * -9.0 + 4.0)),0);
                auVar200 = vshufps_avx(ZEXT416((uint)(fVar234 + -5.0)),
                                       ZEXT416((uint)(fVar234 + -5.0)),0);
                auVar108 = ZEXT416((uint)(fVar236 * -3.0 + 2.0));
                auVar131 = vshufps_avx(auVar108,auVar108,0);
                auVar108 = vdpps_avx(auVar347,auVar347,0x7f);
                auVar133._0_4_ =
                     (float)local_920._0_4_ * auVar131._0_4_ +
                     (float)local_940._0_4_ * auVar200._0_4_ +
                     (float)local_930._0_4_ * auVar19._0_4_ +
                     (float)local_950._0_4_ * auVar132._0_4_;
                auVar133._4_4_ =
                     (float)local_920._4_4_ * auVar131._4_4_ +
                     (float)local_940._4_4_ * auVar200._4_4_ +
                     (float)local_930._4_4_ * auVar19._4_4_ +
                     (float)local_950._4_4_ * auVar132._4_4_;
                auVar133._8_4_ =
                     fStack_918 * auVar131._8_4_ +
                     fStack_938 * auVar200._8_4_ +
                     fStack_928 * auVar19._8_4_ + fStack_948 * auVar132._8_4_;
                auVar133._12_4_ =
                     fStack_914 * auVar131._12_4_ +
                     fStack_934 * auVar200._12_4_ +
                     fStack_924 * auVar19._12_4_ + fStack_944 * auVar132._12_4_;
                auVar200 = vblendps_avx(auVar108,_DAT_01f7aa10,0xe);
                auVar131 = vrsqrtss_avx(auVar200,auVar200);
                fVar144 = auVar131._0_4_;
                fVar123 = auVar108._0_4_;
                auVar131 = vdpps_avx(auVar347,auVar133,0x7f);
                auVar132 = vshufps_avx(auVar108,auVar108,0);
                auVar134._0_4_ = auVar133._0_4_ * auVar132._0_4_;
                auVar134._4_4_ = auVar133._4_4_ * auVar132._4_4_;
                auVar134._8_4_ = auVar133._8_4_ * auVar132._8_4_;
                auVar134._12_4_ = auVar133._12_4_ * auVar132._12_4_;
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                auVar224._0_4_ = auVar347._0_4_ * auVar131._0_4_;
                auVar224._4_4_ = auVar347._4_4_ * auVar131._4_4_;
                auVar224._8_4_ = auVar347._8_4_ * auVar131._8_4_;
                auVar224._12_4_ = auVar347._12_4_ * auVar131._12_4_;
                auVar19 = vsubps_avx(auVar134,auVar224);
                auVar131 = vrcpss_avx(auVar200,auVar200);
                auVar200 = vmaxss_avx(ZEXT416((uint)fVar146),
                                      ZEXT416((uint)(auVar358._0_4_ * (float)local_800._0_4_)));
                auVar131 = ZEXT416((uint)(auVar131._0_4_ * (2.0 - fVar123 * auVar131._0_4_)));
                auVar131 = vshufps_avx(auVar131,auVar131,0);
                uVar76 = CONCAT44(auVar347._4_4_,auVar347._0_4_);
                local_9a0._0_8_ = uVar76 ^ 0x8000000080000000;
                local_9a0._8_4_ = -auVar347._8_4_;
                local_9a0._12_4_ = -auVar347._12_4_;
                auVar132 = ZEXT416((uint)(fVar144 * 1.5 +
                                         fVar123 * -0.5 * fVar144 * fVar144 * fVar144));
                auVar132 = vshufps_avx(auVar132,auVar132,0);
                auVar201._0_4_ = auVar132._0_4_ * auVar19._0_4_ * auVar131._0_4_;
                auVar201._4_4_ = auVar132._4_4_ * auVar19._4_4_ * auVar131._4_4_;
                auVar201._8_4_ = auVar132._8_4_ * auVar19._8_4_ * auVar131._8_4_;
                auVar201._12_4_ = auVar132._12_4_ * auVar19._12_4_ * auVar131._12_4_;
                auVar262._0_4_ = auVar347._0_4_ * auVar132._0_4_;
                auVar262._4_4_ = auVar347._4_4_ * auVar132._4_4_;
                auVar262._8_4_ = auVar347._8_4_ * auVar132._8_4_;
                auVar262._12_4_ = auVar347._12_4_ * auVar132._12_4_;
                local_980._0_4_ = auVar200._0_4_;
                if (fVar123 < 0.0) {
                  local_820._0_16_ = auVar262;
                  local_9c0._0_16_ = auVar201;
                  fVar144 = sqrtf(fVar123);
                  auVar201 = local_9c0._0_16_;
                  auVar262 = local_820._0_16_;
                  fVar123 = (float)local_980._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar144 = auVar108._0_4_;
                  fVar123 = auVar200._0_4_;
                }
                auVar200 = vdpps_avx(_local_8e0,auVar262,0x7f);
                fVar144 = (fVar146 / fVar144) * (fVar213 + 1.0) + fVar213 * fVar146 + fVar123;
                auVar108 = vdpps_avx(local_9a0._0_16_,auVar262,0x7f);
                auVar131 = vdpps_avx(_local_8e0,auVar201,0x7f);
                auVar82._4_4_ = fStack_7bc;
                auVar82._0_4_ = local_7c0;
                auVar82._8_4_ = fStack_7b8;
                auVar82._12_4_ = aStack_7b4.a;
                auVar132 = vdpps_avx(auVar82,auVar262,0x7f);
                auVar19 = vdpps_avx(_local_8e0,local_9a0._0_16_,0x7f);
                fVar149 = auVar108._0_4_ + auVar131._0_4_;
                fVar190 = auVar200._0_4_;
                auVar109._0_4_ = fVar190 * fVar190;
                auVar109._4_4_ = auVar200._4_4_ * auVar200._4_4_;
                auVar109._8_4_ = auVar200._8_4_ * auVar200._8_4_;
                auVar109._12_4_ = auVar200._12_4_ * auVar200._12_4_;
                auVar131 = vsubps_avx(auVar223,auVar109);
                local_9a0._0_16_ = ZEXT416((uint)fVar149);
                auVar108 = vdpps_avx(_local_8e0,auVar82,0x7f);
                fVar212 = auVar19._0_4_ - fVar190 * fVar149;
                fVar190 = auVar108._0_4_ - fVar190 * auVar132._0_4_;
                auVar108 = vrsqrtss_avx(auVar131,auVar131);
                fVar213 = auVar131._0_4_;
                fVar149 = auVar108._0_4_;
                fVar149 = fVar149 * 1.5 + fVar213 * -0.5 * fVar149 * fVar149 * fVar149;
                if (fVar213 < 0.0) {
                  local_820._0_16_ = auVar200;
                  local_9c0._0_16_ = auVar132;
                  local_840._0_4_ = fVar212;
                  local_860._0_4_ = fVar190;
                  local_880._0_4_ = fVar149;
                  fVar213 = sqrtf(fVar213);
                  fVar149 = (float)local_880._0_4_;
                  fVar212 = (float)local_840._0_4_;
                  fVar190 = (float)local_860._0_4_;
                  auVar132 = local_9c0._0_16_;
                  auVar200 = local_820._0_16_;
                  fVar123 = (float)local_980._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar131,auVar131);
                  fVar213 = auVar108._0_4_;
                }
                auVar297 = ZEXT1664(auVar223);
                auVar19 = vpermilps_avx(local_7e0._0_16_,0xff);
                auVar20 = vpermilps_avx(auVar347,0xff);
                fVar212 = fVar212 * fVar149 - auVar20._0_4_;
                auVar225._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
                auVar225._8_4_ = auVar132._8_4_ ^ 0x80000000;
                auVar225._12_4_ = auVar132._12_4_ ^ 0x80000000;
                auVar244._0_4_ = -fVar212;
                auVar244._4_4_ = 0x80000000;
                auVar244._8_4_ = 0x80000000;
                auVar244._12_4_ = 0x80000000;
                auVar108 = vinsertps_avx(auVar244,ZEXT416((uint)(fVar190 * fVar149)),0x1c);
                auVar132 = vmovsldup_avx(ZEXT416((uint)(local_9a0._0_4_ * fVar190 * fVar149 -
                                                       auVar132._0_4_ * fVar212)));
                auVar108 = vdivps_avx(auVar108,auVar132);
                auVar131 = vinsertps_avx(local_9a0._0_16_,auVar225,0x10);
                auVar131 = vdivps_avx(auVar131,auVar132);
                auVar132 = vmovsldup_avx(auVar200);
                auVar135 = ZEXT416((uint)(fVar213 - auVar19._0_4_));
                auVar19 = vmovsldup_avx(auVar135);
                auVar159._0_4_ = auVar132._0_4_ * auVar108._0_4_ + auVar19._0_4_ * auVar131._0_4_;
                auVar159._4_4_ = auVar132._4_4_ * auVar108._4_4_ + auVar19._4_4_ * auVar131._4_4_;
                auVar159._8_4_ = auVar132._8_4_ * auVar108._8_4_ + auVar19._8_4_ * auVar131._8_4_;
                auVar159._12_4_ =
                     auVar132._12_4_ * auVar108._12_4_ + auVar19._12_4_ * auVar131._12_4_;
                auVar108 = vsubps_avx(auVar128,auVar159);
                auVar358 = ZEXT1664(auVar108);
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar200 = vandps_avx(auVar200,auVar160);
                fVar372 = (float)local_9e0._0_4_;
                fVar374 = (float)local_9e0._4_4_;
                fVar189 = fStack_9d8;
                fVar258 = fStack_9d4;
                fVar269 = fStack_9d0;
                fVar270 = fStack_9cc;
                fVar271 = fStack_9c8;
                fVar272 = fStack_9c4;
                if (auVar200._0_4_ < fVar144) {
                  auVar202._8_4_ = 0x7fffffff;
                  auVar202._0_8_ = 0x7fffffff7fffffff;
                  auVar202._12_4_ = 0x7fffffff;
                  auVar200 = vandps_avx(auVar135,auVar202);
                  if (auVar200._0_4_ < (float)local_6e0._0_4_ * 1.9073486e-06 + fVar123 + fVar144) {
                    fVar123 = auVar108._0_4_ + (float)local_7a0._0_4_;
                    bVar87 = 0;
                    if (((ray->org).field_0.m128[3] <= fVar123) &&
                       (fVar144 = ray->tfar, bVar87 = 0, fVar123 <= fVar144)) {
                      auVar200 = vmovshdup_avx(auVar108);
                      bVar87 = 0;
                      fVar146 = auVar200._0_4_;
                      if ((0.0 <= fVar146) && (fVar146 <= 1.0)) {
                        auVar200 = vrsqrtss_avx(auVar223,auVar223);
                        fVar149 = auVar200._0_4_;
                        pGVar13 = (context->scene->geometries).items[uVar88].ptr;
                        if ((pGVar13->mask & ray->mask) == 0) {
                          bVar87 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar87 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0))
                        {
                          auVar200 = ZEXT416((uint)(fVar149 * 1.5 +
                                                   fVar211 * -0.5 * fVar149 * fVar149 * fVar149));
                          auVar200 = vshufps_avx(auVar200,auVar200,0);
                          auVar203._0_4_ = auVar200._0_4_ * (float)local_8e0._0_4_;
                          auVar203._4_4_ = auVar200._4_4_ * (float)local_8e0._4_4_;
                          auVar203._8_4_ = auVar200._8_4_ * fStack_8d8;
                          auVar203._12_4_ = auVar200._12_4_ * fStack_8d4;
                          auVar110._0_4_ = auVar347._0_4_ + auVar20._0_4_ * auVar203._0_4_;
                          auVar110._4_4_ = auVar347._4_4_ + auVar20._4_4_ * auVar203._4_4_;
                          auVar110._8_4_ = auVar347._8_4_ + auVar20._8_4_ * auVar203._8_4_;
                          auVar110._12_4_ = auVar347._12_4_ + auVar20._12_4_ * auVar203._12_4_;
                          auVar200 = vshufps_avx(auVar203,auVar203,0xc9);
                          auVar131 = vshufps_avx(auVar347,auVar347,0xc9);
                          auVar204._0_4_ = auVar131._0_4_ * auVar203._0_4_;
                          auVar204._4_4_ = auVar131._4_4_ * auVar203._4_4_;
                          auVar204._8_4_ = auVar131._8_4_ * auVar203._8_4_;
                          auVar204._12_4_ = auVar131._12_4_ * auVar203._12_4_;
                          auVar226._0_4_ = auVar347._0_4_ * auVar200._0_4_;
                          auVar226._4_4_ = auVar347._4_4_ * auVar200._4_4_;
                          auVar226._8_4_ = auVar347._8_4_ * auVar200._8_4_;
                          auVar226._12_4_ = auVar347._12_4_ * auVar200._12_4_;
                          auVar128 = vsubps_avx(auVar226,auVar204);
                          auVar200 = vshufps_avx(auVar128,auVar128,0xc9);
                          auVar131 = vshufps_avx(auVar110,auVar110,0xc9);
                          auVar227._0_4_ = auVar131._0_4_ * auVar200._0_4_;
                          auVar227._4_4_ = auVar131._4_4_ * auVar200._4_4_;
                          auVar227._8_4_ = auVar131._8_4_ * auVar200._8_4_;
                          auVar227._12_4_ = auVar131._12_4_ * auVar200._12_4_;
                          auVar200 = vshufps_avx(auVar128,auVar128,0xd2);
                          auVar111._0_4_ = auVar110._0_4_ * auVar200._0_4_;
                          auVar111._4_4_ = auVar110._4_4_ * auVar200._4_4_;
                          auVar111._8_4_ = auVar110._8_4_ * auVar200._8_4_;
                          auVar111._12_4_ = auVar110._12_4_ * auVar200._12_4_;
                          auVar131 = vsubps_avx(auVar227,auVar111);
                          auVar200 = vshufps_avx(auVar131,auVar131,0xe9);
                          local_8c0 = vmovlps_avx(auVar200);
                          local_8b8 = auVar131._0_4_;
                          local_8b0 = 0;
                          local_8ac = (undefined4)local_888;
                          local_8a4 = context->user->instID[0];
                          local_8a0 = context->user->instPrimID[0];
                          ray->tfar = fVar123;
                          local_9e4 = -1;
                          local_910.valid = &local_9e4;
                          local_910.geometryUserPtr = pGVar13->userPtr;
                          local_910.context = context->user;
                          local_910.hit = (RTCHitN *)&local_8c0;
                          local_910.N = 1;
                          local_910.ray = (RTCRayN *)ray;
                          local_8b4 = fVar146;
                          local_8a8 = uVar88;
                          if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f94f8d:
                            p_Var16 = context->args->filter;
                            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar297 = ZEXT1664(auVar297._0_16_);
                              auVar358 = ZEXT1664(auVar358._0_16_);
                              (*p_Var16)(&local_910);
                              if (*local_910.valid == 0) goto LAB_00f94fda;
                            }
                            bVar87 = 1;
                          }
                          else {
                            auVar297 = ZEXT1664(auVar223);
                            auVar358 = ZEXT1664(auVar108);
                            (*pGVar13->occlusionFilterN)(&local_910);
                            if (*local_910.valid != 0) goto LAB_00f94f8d;
LAB_00f94fda:
                            ray->tfar = fVar144;
                            bVar87 = 0;
                          }
                          fVar372 = (float)local_9e0._0_4_;
                          fVar374 = (float)local_9e0._4_4_;
                          fVar189 = fStack_9d8;
                          fVar258 = fStack_9d4;
                          fVar269 = fStack_9d0;
                          fVar270 = fStack_9cc;
                          fVar271 = fStack_9c8;
                          fVar272 = fStack_9c4;
                        }
                      }
                    }
                    goto LAB_00f94d53;
                  }
                }
                bVar98 = uVar90 < 4;
                uVar90 = uVar90 + 1;
              } while (uVar90 != 5);
              bVar98 = false;
              bVar87 = 5;
LAB_00f94d53:
              bVar95 = (bool)(bVar95 | bVar98 & bVar87);
              fVar123 = ray->tfar;
              auVar118._4_4_ = fVar123;
              auVar118._0_4_ = fVar123;
              auVar118._8_4_ = fVar123;
              auVar118._12_4_ = fVar123;
              auVar118._16_4_ = fVar123;
              auVar118._20_4_ = fVar123;
              auVar118._24_4_ = fVar123;
              auVar118._28_4_ = fVar123;
              auVar114 = vcmpps_avx(_local_700,auVar118,2);
              auVar113 = vandps_avx(auVar114,local_6a0);
              auVar114 = local_6a0 & auVar114;
              local_6a0 = auVar113;
            } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar114 >> 0x7f,0) != '\0') ||
                       (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar114 >> 0xbf,0) != '\0') ||
                     (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar114[0x1f] < '\0');
          }
          auVar113 = vandps_avx(local_580,local_560);
          auVar114 = vandps_avx(_local_780,_local_760);
          auVar232._0_4_ = fVar372 + local_480._0_4_;
          auVar232._4_4_ = fVar374 + local_480._4_4_;
          auVar232._8_4_ = fVar189 + local_480._8_4_;
          auVar232._12_4_ = fVar258 + local_480._12_4_;
          auVar232._16_4_ = fVar269 + local_480._16_4_;
          auVar232._20_4_ = fVar270 + local_480._20_4_;
          auVar232._24_4_ = fVar271 + local_480._24_4_;
          auVar232._28_4_ = fVar272 + local_480._28_4_;
          auVar25 = vcmpps_avx(auVar232,auVar118,2);
          auVar113 = vandps_avx(auVar25,auVar113);
          auVar233._0_4_ = fVar372 + local_4c0._0_4_;
          auVar233._4_4_ = fVar374 + local_4c0._4_4_;
          auVar233._8_4_ = fVar189 + local_4c0._8_4_;
          auVar233._12_4_ = fVar258 + local_4c0._12_4_;
          auVar233._16_4_ = fVar269 + local_4c0._16_4_;
          auVar233._20_4_ = fVar270 + local_4c0._20_4_;
          auVar233._24_4_ = fVar271 + local_4c0._24_4_;
          auVar233._28_4_ = fVar272 + local_4c0._28_4_;
          auVar25 = vcmpps_avx(auVar233,auVar118,2);
          auVar114 = vandps_avx(auVar25,auVar114);
          auVar114 = vorps_avx(auVar113,auVar114);
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar114;
            auVar113 = vblendvps_avx(_local_4c0,local_480,auVar113);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar113;
            uVar8 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar97 * 0xc] = uVar8;
            aiStack_138[uVar97 * 0x18] = local_b24 + 1;
            iVar96 = iVar96 + 1;
          }
        }
      }
    }
    auVar11._0_4_ = ray->tfar;
    auVar11._4_4_ = ray->mask;
    auVar11._8_4_ = ray->id;
    auVar11._12_4_ = ray->flags;
    if (iVar96 == 0) break;
    fVar123 = ray->tfar;
    auVar142._4_4_ = fVar123;
    auVar142._0_4_ = fVar123;
    auVar142._8_4_ = fVar123;
    auVar142._12_4_ = fVar123;
    auVar142._16_4_ = fVar123;
    auVar142._20_4_ = fVar123;
    auVar142._24_4_ = fVar123;
    auVar142._28_4_ = fVar123;
    uVar92 = -iVar96;
    pauVar91 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar96 - 1) * 0x60);
    while( true ) {
      auVar113 = pauVar91[1];
      auVar169._0_4_ = fVar372 + auVar113._0_4_;
      auVar169._4_4_ = fVar374 + auVar113._4_4_;
      auVar169._8_4_ = fVar189 + auVar113._8_4_;
      auVar169._12_4_ = fVar258 + auVar113._12_4_;
      auVar169._16_4_ = fVar269 + auVar113._16_4_;
      auVar169._20_4_ = fVar270 + auVar113._20_4_;
      auVar169._24_4_ = fVar271 + auVar113._24_4_;
      auVar169._28_4_ = fVar272 + auVar113._28_4_;
      auVar25 = vcmpps_avx(auVar169,auVar142,2);
      auVar114 = vandps_avx(auVar25,*pauVar91);
      local_480 = auVar114;
      auVar25 = *pauVar91 & auVar25;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') break;
      pauVar91 = pauVar91 + -3;
      uVar92 = uVar92 + 1;
      if (uVar92 == 0) goto LAB_00f952c4;
    }
    auVar121._8_4_ = 0x7f800000;
    auVar121._0_8_ = 0x7f8000007f800000;
    auVar121._12_4_ = 0x7f800000;
    auVar121._16_4_ = 0x7f800000;
    auVar121._20_4_ = 0x7f800000;
    auVar121._24_4_ = 0x7f800000;
    auVar121._28_4_ = 0x7f800000;
    auVar113 = vblendvps_avx(auVar121,auVar113,auVar114);
    auVar25 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar25 = vminps_avx(auVar113,auVar25);
    auVar22 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar22);
    auVar22 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar22);
    auVar113 = vcmpps_avx(auVar113,auVar25,0);
    auVar25 = auVar114 & auVar113;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar114 = vandps_avx(auVar113,auVar114);
    }
    auVar112._8_8_ = 0;
    auVar112._0_8_ = *(ulong *)pauVar91[2];
    local_b24 = *(uint *)(pauVar91[2] + 8);
    uVar93 = vmovmskps_avx(auVar114);
    uVar89 = 0;
    if (uVar93 != 0) {
      for (; (uVar93 >> uVar89 & 1) == 0; uVar89 = uVar89 + 1) {
      }
    }
    *(undefined4 *)(local_480 + (ulong)uVar89 * 4) = 0;
    *pauVar91 = local_480;
    uVar93 = ~uVar92;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar93 = -uVar92;
    }
    uVar97 = (ulong)uVar93;
    auVar223 = vshufps_avx(auVar112,auVar112,0);
    auVar200 = vshufps_avx(auVar112,auVar112,0x55);
    auVar200 = vsubps_avx(auVar200,auVar223);
    local_4c0._4_4_ = auVar223._4_4_ + auVar200._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar223._0_4_ + auVar200._0_4_ * 0.0;
    fStack_4b8 = auVar223._8_4_ + auVar200._8_4_ * 0.2857143;
    fStack_4b4 = auVar223._12_4_ + auVar200._12_4_ * 0.42857146;
    fStack_4b0 = auVar223._0_4_ + auVar200._0_4_ * 0.5714286;
    fStack_4ac = auVar223._4_4_ + auVar200._4_4_ * 0.71428573;
    fStack_4a8 = auVar223._8_4_ + auVar200._8_4_ * 0.8571429;
    fStack_4a4 = auVar223._12_4_ + auVar200._12_4_;
    local_4d0._8_8_ = 0;
    local_4d0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar89 * 4);
  } while( true );
LAB_00f952c4:
  if (bVar95 != false) {
    return bVar95;
  }
  auVar260 = vshufps_avx(auVar11,auVar11,0);
  auVar260 = vcmpps_avx(local_4e0,auVar260,2);
  uVar88 = vmovmskps_avx(auVar260);
  uVar88 = (uint)local_788 - 1 & (uint)local_788 & uVar88;
  if (uVar88 == 0) {
    return false;
  }
  goto LAB_00f92751;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }